

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  long lVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  uint uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  int iVar100;
  float fVar101;
  undefined4 uVar102;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  vfloat4 b0;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vint4 ai_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar187;
  float fVar188;
  __m128 a;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar189;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  float fVar216;
  vfloat4 a0_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar218;
  float fVar228;
  float fVar230;
  undefined1 auVar219 [16];
  float fVar229;
  float fVar231;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar243;
  vfloat4 b0_2;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  vfloat4 a0_3;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 uStack_220;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  float fVar137;
  float fVar145;
  undefined1 auVar256 [32];
  
  PVar4 = prim[1];
  uVar26 = (ulong)(byte)PVar4;
  lVar28 = uVar26 * 0x25;
  fVar101 = *(float *)(prim + lVar28 + 0x12);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar39 = vsubps_avx(auVar39,*(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar64._0_4_ = fVar101 * auVar39._0_4_;
  auVar64._4_4_ = fVar101 * auVar39._4_4_;
  auVar64._8_4_ = fVar101 * auVar39._8_4_;
  auVar64._12_4_ = fVar101 * auVar39._12_4_;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar49._0_4_ = fVar101 * auVar40._0_4_;
  auVar49._4_4_ = fVar101 * auVar40._4_4_;
  auVar49._8_4_ = fVar101 * auVar40._8_4_;
  auVar49._12_4_ = fVar101 * auVar40._12_4_;
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xf + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar26 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1a + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1b + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1c + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar146._4_4_ = auVar49._0_4_;
  auVar146._0_4_ = auVar49._0_4_;
  auVar146._8_4_ = auVar49._0_4_;
  auVar146._12_4_ = auVar49._0_4_;
  auVar44 = vshufps_avx(auVar49,auVar49,0x55);
  auVar42 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar101 = auVar42._0_4_;
  auVar61._0_4_ = fVar101 * auVar53._0_4_;
  fVar109 = auVar42._4_4_;
  auVar61._4_4_ = fVar109 * auVar53._4_4_;
  fVar234 = auVar42._8_4_;
  auVar61._8_4_ = fVar234 * auVar53._8_4_;
  fVar218 = auVar42._12_4_;
  auVar61._12_4_ = fVar218 * auVar53._12_4_;
  auVar63._0_4_ = auVar57._0_4_ * fVar101;
  auVar63._4_4_ = auVar57._4_4_ * fVar109;
  auVar63._8_4_ = auVar57._8_4_ * fVar234;
  auVar63._12_4_ = auVar57._12_4_ * fVar218;
  auVar50._0_4_ = auVar41._0_4_ * fVar101;
  auVar50._4_4_ = auVar41._4_4_ * fVar109;
  auVar50._8_4_ = auVar41._8_4_ * fVar234;
  auVar50._12_4_ = auVar41._12_4_ * fVar218;
  auVar42 = vfmadd231ps_fma(auVar61,auVar44,auVar40);
  auVar43 = vfmadd231ps_fma(auVar63,auVar44,auVar58);
  auVar44 = vfmadd231ps_fma(auVar50,auVar60,auVar44);
  auVar45 = vfmadd231ps_fma(auVar42,auVar146,auVar39);
  auVar43 = vfmadd231ps_fma(auVar43,auVar146,auVar54);
  auVar46 = vfmadd231ps_fma(auVar44,auVar59,auVar146);
  auVar249._4_4_ = auVar64._0_4_;
  auVar249._0_4_ = auVar64._0_4_;
  auVar249._8_4_ = auVar64._0_4_;
  auVar249._12_4_ = auVar64._0_4_;
  auVar44 = vshufps_avx(auVar64,auVar64,0x55);
  auVar42 = vshufps_avx(auVar64,auVar64,0xaa);
  fVar101 = auVar42._0_4_;
  auVar147._0_4_ = fVar101 * auVar53._0_4_;
  fVar109 = auVar42._4_4_;
  auVar147._4_4_ = fVar109 * auVar53._4_4_;
  fVar234 = auVar42._8_4_;
  auVar147._8_4_ = fVar234 * auVar53._8_4_;
  fVar218 = auVar42._12_4_;
  auVar147._12_4_ = fVar218 * auVar53._12_4_;
  auVar66._0_4_ = auVar57._0_4_ * fVar101;
  auVar66._4_4_ = auVar57._4_4_ * fVar109;
  auVar66._8_4_ = auVar57._8_4_ * fVar234;
  auVar66._12_4_ = auVar57._12_4_ * fVar218;
  auVar65._0_4_ = auVar41._0_4_ * fVar101;
  auVar65._4_4_ = auVar41._4_4_ * fVar109;
  auVar65._8_4_ = auVar41._8_4_ * fVar234;
  auVar65._12_4_ = auVar41._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar147,auVar44,auVar40);
  auVar53 = vfmadd231ps_fma(auVar66,auVar44,auVar58);
  auVar58 = vfmadd231ps_fma(auVar65,auVar44,auVar60);
  auVar48 = vfmadd231ps_fma(auVar40,auVar249,auVar39);
  auVar49 = vfmadd231ps_fma(auVar53,auVar249,auVar54);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar270 = ZEXT1664(auVar39);
  auVar50 = vfmadd231ps_fma(auVar58,auVar249,auVar59);
  auVar40 = vandps_avx512vl(auVar45,auVar39);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar40,auVar178,1);
  bVar32 = (bool)((byte)uVar38 & 1);
  auVar51._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._0_4_;
  bVar32 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._4_4_;
  bVar32 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._8_4_;
  bVar32 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._12_4_;
  auVar40 = vandps_avx512vl(auVar43,auVar39);
  uVar38 = vcmpps_avx512vl(auVar40,auVar178,1);
  bVar32 = (bool)((byte)uVar38 & 1);
  auVar52._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._0_4_;
  bVar32 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._4_4_;
  bVar32 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._8_4_;
  bVar32 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._12_4_;
  auVar39 = vandps_avx512vl(auVar46,auVar39);
  uVar38 = vcmpps_avx512vl(auVar39,auVar178,1);
  bVar32 = (bool)((byte)uVar38 & 1);
  auVar55._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._0_4_;
  bVar32 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._4_4_;
  bVar32 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._8_4_;
  bVar32 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar55._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar46._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar51);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar51,auVar40,auVar179);
  auVar45 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar52);
  auVar39 = vfnmadd213ps_fma(auVar52,auVar40,auVar179);
  auVar46 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar55);
  auVar39 = vfnmadd213ps_fma(auVar55,auVar40,auVar179);
  auVar47 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  fVar101 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar165._4_4_ = fVar101;
  auVar165._0_4_ = fVar101;
  auVar165._8_4_ = fVar101;
  auVar165._12_4_ = fVar101;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar54 = vsubps_avx(auVar40,auVar39);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar53);
  auVar53 = vfmadd213ps_fma(auVar54,auVar165,auVar39);
  auVar39 = vcvtdq2ps_avx(auVar40);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar40 = vpmovsxwd_avx(auVar54);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar54 = vfmadd213ps_fma(auVar40,auVar165,auVar39);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar39 = vpmovsxwd_avx(auVar58);
  auVar39 = vcvtdq2ps_avx(auVar39);
  uVar38 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar26 * 2 + uVar38 + 6);
  auVar40 = vpmovsxwd_avx(auVar57);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar58 = vfmadd213ps_fma(auVar40,auVar165,auVar39);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar39 = vpmovsxwd_avx(auVar59);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar26 * 0x18 + 6);
  auVar40 = vpmovsxwd_avx(auVar60);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar57 = vfmadd213ps_fma(auVar40,auVar165,auVar39);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 * 0x1d + 6);
  auVar39 = vpmovsxwd_avx(auVar41);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar40 = vpmovsxwd_avx(auVar44);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar59 = vfmadd213ps_fma(auVar40,auVar165,auVar39);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar26) + 6);
  auVar39 = vpmovsxwd_avx(auVar42);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar26 * 0x23 + 6);
  auVar40 = vpmovsxwd_avx(auVar43);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar40 = vfmadd213ps_fma(auVar40,auVar165,auVar39);
  auVar39 = vsubps_avx(auVar53,auVar48);
  auVar166._0_4_ = auVar45._0_4_ * auVar39._0_4_;
  auVar166._4_4_ = auVar45._4_4_ * auVar39._4_4_;
  auVar166._8_4_ = auVar45._8_4_ * auVar39._8_4_;
  auVar166._12_4_ = auVar45._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar54,auVar48);
  auVar62._0_4_ = auVar45._0_4_ * auVar39._0_4_;
  auVar62._4_4_ = auVar45._4_4_ * auVar39._4_4_;
  auVar62._8_4_ = auVar45._8_4_ * auVar39._8_4_;
  auVar62._12_4_ = auVar45._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar58,auVar49);
  auVar148._0_4_ = auVar46._0_4_ * auVar39._0_4_;
  auVar148._4_4_ = auVar46._4_4_ * auVar39._4_4_;
  auVar148._8_4_ = auVar46._8_4_ * auVar39._8_4_;
  auVar148._12_4_ = auVar46._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar57,auVar49);
  auVar67._0_4_ = auVar46._0_4_ * auVar39._0_4_;
  auVar67._4_4_ = auVar46._4_4_ * auVar39._4_4_;
  auVar67._8_4_ = auVar46._8_4_ * auVar39._8_4_;
  auVar67._12_4_ = auVar46._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar59,auVar50);
  auVar138._0_4_ = auVar47._0_4_ * auVar39._0_4_;
  auVar138._4_4_ = auVar47._4_4_ * auVar39._4_4_;
  auVar138._8_4_ = auVar47._8_4_ * auVar39._8_4_;
  auVar138._12_4_ = auVar47._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar40,auVar50);
  auVar56._0_4_ = auVar47._0_4_ * auVar39._0_4_;
  auVar56._4_4_ = auVar47._4_4_ * auVar39._4_4_;
  auVar56._8_4_ = auVar47._8_4_ * auVar39._8_4_;
  auVar56._12_4_ = auVar47._12_4_ * auVar39._12_4_;
  auVar39 = vpminsd_avx(auVar166,auVar62);
  auVar40 = vpminsd_avx(auVar148,auVar67);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar40 = vpminsd_avx(auVar138,auVar56);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar45._4_4_ = uVar102;
  auVar45._0_4_ = uVar102;
  auVar45._8_4_ = uVar102;
  auVar45._12_4_ = uVar102;
  auVar40 = vmaxps_avx512vl(auVar40,auVar45);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar46._8_4_ = 0x3f7ffffa;
  auVar46._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar46._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar39,auVar46);
  auVar39 = vpmaxsd_avx(auVar166,auVar62);
  auVar40 = vpmaxsd_avx(auVar148,auVar67);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar40 = vpmaxsd_avx(auVar138,auVar56);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar47._4_4_ = uVar102;
  auVar47._0_4_ = uVar102;
  auVar47._8_4_ = uVar102;
  auVar47._12_4_ = uVar102;
  auVar40 = vminps_avx512vl(auVar40,auVar47);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar39 = vmulps_avx512vl(auVar39,auVar48);
  auVar40 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_3a0,auVar39,2);
  uVar38 = vpcmpgtd_avx512vl(auVar40,_DAT_01f7fcf0);
  uVar38 = ((byte)uVar18 & 0xf) & uVar38;
  if ((char)uVar38 == '\0') {
    return false;
  }
  local_200 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar39 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar265 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar269 = ZEXT1664(auVar39);
LAB_01c03384:
  lVar28 = 0;
  for (uVar26 = uVar38; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar33 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar33].ptr;
  fVar101 = (pGVar6->time_range).lower;
  fVar101 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar101) / ((pGVar6->time_range).upper - fVar101));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar41 = vmaxss_avx512f(auVar265._0_16_,auVar39);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar28 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (long)(int)auVar41._0_4_ * 0x38;
  lVar8 = *(long *)(_Var7 + 0x10 + lVar29);
  auVar39 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar29) + lVar8 * uVar26);
  lVar28 = uVar26 + 1;
  auVar40 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar29) + lVar8 * lVar28);
  p_Var9 = pGVar6[4].occlusionFilterN;
  lVar8 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar8 + 0x10 + lVar29);
  auVar53 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar29) + lVar10 * uVar26);
  auVar54 = *(undefined1 (*) [16])(*(long *)(lVar8 + lVar29) + lVar10 * lVar28);
  _Var11 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar10 = *(long *)(_Var11 + 0x10 + lVar29);
  lVar12 = *(long *)(_Var7 + 0x38 + lVar29);
  lVar13 = *(long *)(_Var7 + 0x48 + lVar29);
  auVar58 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar26);
  auVar57 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar28);
  lVar12 = *(long *)(lVar8 + 0x38 + lVar29);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar29);
  auVar59 = *(undefined1 (*) [16])(lVar12 + lVar8 * uVar26);
  auVar60 = *(undefined1 (*) [16])(lVar12 + lVar8 * lVar28);
  auVar68 = vpbroadcastd_avx512vl();
  local_1c0 = vmovdqa64_avx512vl(auVar68);
  lVar8 = *(long *)(_Var11 + 0x38 + lVar29);
  lVar12 = *(long *)(_Var11 + 0x48 + lVar29);
  auVar84._16_16_ = auVar68._16_16_;
  auVar42 = vsubss_avx512f(ZEXT416((uint)fVar101),auVar41);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar29) + *(long *)(p_Var9 + lVar29 + 0x10) * uVar26),
                       auVar39,auVar43);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar29) + *(long *)(p_Var9 + lVar29 + 0x10) * lVar28),
                       auVar40,auVar43);
  auVar45 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar29) + lVar10 * uVar26),auVar53,
                       auVar43);
  auVar46 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var11 + lVar29) + lVar10 * lVar28),auVar54,
                       auVar43);
  auVar84._0_16_ = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
  auVar47 = vmulps_avx512vl(auVar40,auVar84._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar44,auVar84._0_16_);
  auVar48 = vpxord_avx512vl(auVar68._0_16_,auVar68._0_16_);
  auVar48 = vfmadd213ps_avx512vl(auVar48,auVar41,auVar47);
  auVar48 = vaddps_avx512vl(auVar39,auVar48);
  auVar63 = auVar269._0_16_;
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar41,auVar63);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar39,auVar63);
  auVar49 = vmulps_avx512vl(auVar54,auVar84._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,auVar84._0_16_);
  auVar50 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar45,auVar49);
  auVar51 = vaddps_avx512vl(auVar53,auVar50);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar45,auVar63);
  auVar49 = vfnmadd231ps_avx512vl(auVar49,auVar53,auVar63);
  auVar50 = vxorps_avx512vl(auVar50,auVar50);
  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar44,auVar40);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar41,auVar84._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar84._0_16_);
  auVar40 = vmulps_avx512vl(auVar40,auVar63);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar63,auVar44);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar84._0_16_,auVar41);
  auVar52 = vfnmadd231ps_avx512vl(auVar40,auVar84._0_16_,auVar39);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar54);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar84._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar39,auVar53,auVar84._0_16_);
  auVar39 = vmulps_avx512vl(auVar54,auVar63);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar63,auVar46);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar84._0_16_,auVar45);
  auVar44 = vfnmadd231ps_avx512vl(auVar39,auVar84._0_16_,auVar53);
  auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar53 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  fVar229 = auVar47._0_4_;
  auVar149._0_4_ = fVar229 * auVar53._0_4_;
  fVar230 = auVar47._4_4_;
  auVar149._4_4_ = fVar230 * auVar53._4_4_;
  fVar137 = auVar47._8_4_;
  auVar149._8_4_ = fVar137 * auVar53._8_4_;
  fVar145 = auVar47._12_4_;
  auVar149._12_4_ = fVar145 * auVar53._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar149,auVar39,auVar51);
  auVar53 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar54 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  auVar167._0_4_ = fVar229 * auVar54._0_4_;
  auVar167._4_4_ = fVar230 * auVar54._4_4_;
  auVar167._8_4_ = fVar137 * auVar54._8_4_;
  auVar167._12_4_ = fVar145 * auVar54._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar167,auVar39,auVar49);
  auVar54 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar45 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar39 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar39 = vmulps_avx512vl(auVar52,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar45,auVar40);
  auVar41 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vmulps_avx512vl(auVar52,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar45,auVar44);
  auVar44 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar68._4_28_ = auVar84._4_28_;
  auVar68._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar84._0_16_,auVar68._0_16_);
  auVar45 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar46 = vmulss_avx512f(auVar46,auVar40);
  auVar40 = vmulss_avx512f(auVar46,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  fVar234 = auVar45._0_4_ - auVar40._0_4_;
  auVar190._4_4_ = fVar234;
  auVar190._0_4_ = fVar234;
  auVar190._8_4_ = fVar234;
  auVar190._12_4_ = fVar234;
  auVar40 = vdpps_avx(auVar53,auVar54,0x7f);
  auVar45 = vmulps_avx512vl(auVar53,auVar190);
  auVar46 = vbroadcastss_avx512vl(auVar39);
  auVar54 = vmulps_avx512vl(auVar46,auVar54);
  fVar101 = auVar40._0_4_;
  auVar150._0_4_ = fVar101 * auVar53._0_4_;
  auVar150._4_4_ = fVar101 * auVar53._4_4_;
  auVar150._8_4_ = fVar101 * auVar53._8_4_;
  auVar150._12_4_ = fVar101 * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar54,auVar150);
  auVar40 = vrcp14ss_avx512f(auVar84._0_16_,auVar68._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
  fVar101 = auVar40._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar41,auVar41,0x7f);
  auVar69._16_16_ = auVar84._16_16_;
  auVar69._0_16_ = auVar84._0_16_;
  auVar86._4_28_ = auVar69._4_28_;
  auVar86._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar84._0_16_,auVar86._0_16_);
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar109 = auVar40._0_4_;
  fVar218 = auVar54._0_4_ - auVar46._0_4_ * fVar109 * fVar109 * fVar109;
  auVar191._0_4_ = auVar41._0_4_ * fVar218;
  auVar191._4_4_ = auVar41._4_4_ * fVar218;
  auVar191._8_4_ = auVar41._8_4_ * fVar218;
  auVar191._12_4_ = auVar41._12_4_ * fVar218;
  auVar40 = vdpps_avx(auVar41,auVar44,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar39);
  auVar54 = vmulps_avx512vl(auVar54,auVar44);
  fVar109 = auVar40._0_4_;
  auVar103._0_4_ = fVar109 * auVar41._0_4_;
  auVar103._4_4_ = fVar109 * auVar41._4_4_;
  auVar103._8_4_ = fVar109 * auVar41._8_4_;
  auVar103._12_4_ = fVar109 * auVar41._12_4_;
  auVar40 = vsubps_avx(auVar54,auVar103);
  auVar54 = vrcp14ss_avx512f(auVar84._0_16_,auVar86._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar54,ZEXT416(0x40000000));
  fVar109 = auVar54._0_4_ * auVar39._0_4_;
  auVar54 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar41 = vmulps_avx512vl(auVar54,auVar45);
  auVar44 = vsubps_avx512vl(auVar48,auVar41);
  auVar39 = vshufps_avx(auVar47,auVar47,0xff);
  auVar39 = vmulps_avx512vl(auVar39,auVar45);
  auVar125._0_4_ = auVar39._0_4_ + auVar54._0_4_ * fVar234 * fVar101 * auVar53._0_4_;
  auVar125._4_4_ = auVar39._4_4_ + auVar54._4_4_ * fVar234 * fVar101 * auVar53._4_4_;
  auVar125._8_4_ = auVar39._8_4_ + auVar54._8_4_ * fVar234 * fVar101 * auVar53._8_4_;
  auVar125._12_4_ = auVar39._12_4_ + auVar54._12_4_ * fVar234 * fVar101 * auVar53._12_4_;
  auVar39 = vsubps_avx(auVar47,auVar125);
  auVar45 = vaddps_avx512vl(auVar48,auVar41);
  auVar168._0_4_ = fVar229 + auVar125._0_4_;
  auVar168._4_4_ = fVar230 + auVar125._4_4_;
  auVar168._8_4_ = fVar137 + auVar125._8_4_;
  auVar168._12_4_ = fVar145 + auVar125._12_4_;
  auVar53 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar199._0_4_ = auVar191._0_4_ * auVar53._0_4_;
  auVar199._4_4_ = auVar191._4_4_ * auVar53._4_4_;
  auVar199._8_4_ = auVar191._8_4_ * auVar53._8_4_;
  auVar199._12_4_ = auVar191._12_4_ * auVar53._12_4_;
  auVar46 = vsubps_avx512vl(auVar50,auVar199);
  auVar54 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar41 = vmulps_avx512vl(auVar54,auVar191);
  auVar151._0_4_ = auVar41._0_4_ + auVar53._0_4_ * fVar218 * auVar40._0_4_ * fVar109;
  auVar151._4_4_ = auVar41._4_4_ + auVar53._4_4_ * fVar218 * auVar40._4_4_ * fVar109;
  auVar151._8_4_ = auVar41._8_4_ + auVar53._8_4_ * fVar218 * auVar40._8_4_ * fVar109;
  auVar151._12_4_ = auVar41._12_4_ + auVar53._12_4_ * fVar218 * auVar40._12_4_ * fVar109;
  auVar40 = vsubps_avx512vl(auVar52,auVar151);
  auVar47 = vaddps_avx512vl(auVar50,auVar199);
  auVar53 = vaddps_avx512vl(auVar52,auVar151);
  auVar39 = vmulps_avx512vl(auVar39,auVar43);
  auVar180._0_4_ = auVar44._0_4_ + auVar39._0_4_;
  auVar180._4_4_ = auVar44._4_4_ + auVar39._4_4_;
  auVar180._8_4_ = auVar44._8_4_ + auVar39._8_4_;
  auVar180._12_4_ = auVar44._12_4_ + auVar39._12_4_;
  auVar39 = vmulps_avx512vl(auVar40,auVar43);
  auVar41 = vsubps_avx(auVar46,auVar39);
  auVar39 = vmulps_avx512vl(auVar168,auVar43);
  auVar48 = vaddps_avx512vl(auVar45,auVar39);
  auVar39 = vmulps_avx512vl(auVar53,auVar43);
  auVar49 = vsubps_avx512vl(auVar47,auVar39);
  auVar39 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar29 + 0x38) +
                        *(long *)(p_Var9 + lVar29 + 0x48) * uVar26),auVar58,auVar43);
  auVar40 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar29 + 0x38) +
                        *(long *)(p_Var9 + lVar29 + 0x48) * lVar28),auVar57,auVar43);
  auVar53 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + uVar26 * lVar12),auVar59,auVar43);
  auVar51 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar8 + lVar12 * lVar28),auVar60,auVar43);
  auVar52 = vmulps_avx512vl(auVar57,auVar84._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar40,auVar84._0_16_);
  auVar54 = vxorps_avx512vl(auVar54,auVar54);
  auVar54 = vfmadd213ps_avx512vl(auVar54,auVar39,auVar52);
  auVar55 = vaddps_avx512vl(auVar58,auVar54);
  auVar54 = vfmadd231ps_avx512vl(auVar52,auVar39,auVar63);
  auVar52 = vfnmadd231ps_avx512vl(auVar54,auVar58,auVar63);
  auVar54 = vmulps_avx512vl(auVar60,auVar84._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar84._0_16_);
  auVar50 = vxorps_avx512vl(auVar50,auVar50);
  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar53,auVar54);
  auVar56 = vaddps_avx512vl(auVar59,auVar50);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar53,auVar63);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar59,auVar63);
  auVar50 = vxorps_avx512vl(auVar50,auVar50);
  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar40,auVar57);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar39,auVar84._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar84._0_16_);
  auVar57 = vmulps_avx512vl(auVar57,auVar63);
  auVar40 = vfnmadd231ps_avx512vl(auVar57,auVar63,auVar40);
  auVar39 = vfmadd231ps_avx512vl(auVar40,auVar84._0_16_,auVar39);
  auVar58 = vfnmadd231ps_avx512vl(auVar39,auVar84._0_16_,auVar58);
  auVar39 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar51,auVar60);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar53,auVar84._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar39,auVar59,auVar84._0_16_);
  auVar39 = vmulps_avx512vl(auVar60,auVar63);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar63,auVar51);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar84._0_16_,auVar53);
  auVar59 = vfnmadd231ps_avx512vl(auVar39,auVar84._0_16_,auVar59);
  auVar39 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar40 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  fVar234 = auVar52._0_4_;
  auVar250._0_4_ = fVar234 * auVar40._0_4_;
  fVar218 = auVar52._4_4_;
  auVar250._4_4_ = fVar218 * auVar40._4_4_;
  fVar229 = auVar52._8_4_;
  auVar250._8_4_ = fVar229 * auVar40._8_4_;
  fVar230 = auVar52._12_4_;
  auVar250._12_4_ = fVar230 * auVar40._12_4_;
  auVar40 = vfmsub231ps_avx512vl(auVar250,auVar39,auVar56);
  auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar257._0_4_ = fVar234 * auVar40._0_4_;
  auVar257._4_4_ = fVar218 * auVar40._4_4_;
  auVar257._8_4_ = fVar229 * auVar40._8_4_;
  auVar257._12_4_ = fVar230 * auVar40._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar257,auVar39,auVar54);
  auVar54 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar40 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar39 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar39 = vmulps_avx512vl(auVar58,auVar39);
  auVar39 = vfmsub231ps_avx512vl(auVar39,auVar40,auVar57);
  auVar57 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar60 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar60 = vmulps_avx512vl(auVar58,auVar60);
  auVar40 = vfmsub231ps_avx512vl(auVar60,auVar40,auVar59);
  auVar59 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar70._16_16_ = auVar84._16_16_;
  auVar70._0_16_ = auVar84._0_16_;
  auVar71._4_28_ = auVar70._4_28_;
  auVar71._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar84._0_16_,auVar71._0_16_);
  auVar60 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar51 = vmulss_avx512f(auVar51,auVar40);
  auVar40 = vmulss_avx512f(auVar40,auVar40);
  auVar40 = vmulss_avx512f(auVar51,auVar40);
  auVar40 = vsubss_avx512f(auVar60,auVar40);
  auVar60 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vmulps_avx512vl(auVar53,auVar60);
  auVar40 = vdpps_avx(auVar53,auVar54,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar39);
  auVar54 = vmulps_avx512vl(auVar56,auVar54);
  fVar101 = auVar40._0_4_;
  auVar152._0_4_ = auVar53._0_4_ * fVar101;
  auVar152._4_4_ = auVar53._4_4_ * fVar101;
  auVar152._8_4_ = auVar53._8_4_ * fVar101;
  auVar152._12_4_ = auVar53._12_4_ * fVar101;
  auVar40 = vsubps_avx(auVar54,auVar152);
  auVar53 = vrcp14ss_avx512f(auVar84._0_16_,auVar71._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar53,ZEXT416(0x40000000));
  fVar101 = auVar53._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar110._0_4_ = fVar101 * auVar40._0_4_;
  auVar110._4_4_ = fVar101 * auVar40._4_4_;
  auVar110._8_4_ = fVar101 * auVar40._8_4_;
  auVar110._12_4_ = fVar101 * auVar40._12_4_;
  auVar53 = vmulps_avx512vl(auVar60,auVar110);
  auVar72._16_16_ = auVar84._16_16_;
  auVar72._0_16_ = auVar84._0_16_;
  auVar73._4_28_ = auVar72._4_28_;
  auVar73._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar84._0_16_,auVar73._0_16_);
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar60 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar271 = ZEXT464(0x3f800000);
  auVar60 = vmulss_avx512f(auVar60,auVar40);
  auVar40 = vmulss_avx512f(auVar60,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  fVar109 = auVar54._0_4_ - auVar40._0_4_;
  auVar258._0_4_ = auVar57._0_4_ * fVar109;
  auVar258._4_4_ = auVar57._4_4_ * fVar109;
  auVar258._8_4_ = auVar57._8_4_ * fVar109;
  auVar258._12_4_ = auVar57._12_4_ * fVar109;
  auVar40 = vdpps_avx(auVar57,auVar59,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar39);
  auVar54 = vmulps_avx512vl(auVar54,auVar59);
  fVar101 = auVar40._0_4_;
  auVar169._0_4_ = auVar57._0_4_ * fVar101;
  auVar169._4_4_ = auVar57._4_4_ * fVar101;
  auVar169._8_4_ = auVar57._8_4_ * fVar101;
  auVar169._12_4_ = auVar57._12_4_ * fVar101;
  auVar40 = vsubps_avx(auVar54,auVar169);
  auVar54 = vrcp14ss_avx512f(auVar84._0_16_,auVar73._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar54,ZEXT416(0x40000000));
  fVar101 = auVar39._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar57 = vmulps_avx512vl(auVar54,auVar51);
  auVar59 = vsubps_avx512vl(auVar55,auVar57);
  auVar39 = vshufps_avx(auVar52,auVar52,0xff);
  auVar39 = vmulps_avx512vl(auVar39,auVar51);
  auVar111._0_4_ = auVar39._0_4_ + auVar54._0_4_ * auVar53._0_4_;
  auVar111._4_4_ = auVar39._4_4_ + auVar54._4_4_ * auVar53._4_4_;
  auVar111._8_4_ = auVar39._8_4_ + auVar54._8_4_ * auVar53._8_4_;
  auVar111._12_4_ = auVar39._12_4_ + auVar54._12_4_ * auVar53._12_4_;
  auVar39 = vsubps_avx(auVar52,auVar111);
  auVar53 = vaddps_avx512vl(auVar55,auVar57);
  auVar112._0_4_ = fVar234 + auVar111._0_4_;
  auVar112._4_4_ = fVar218 + auVar111._4_4_;
  auVar112._8_4_ = fVar229 + auVar111._8_4_;
  auVar112._12_4_ = fVar230 + auVar111._12_4_;
  auVar54 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar244._0_4_ = auVar54._0_4_ * auVar258._0_4_;
  auVar244._4_4_ = auVar54._4_4_ * auVar258._4_4_;
  auVar244._8_4_ = auVar54._8_4_ * auVar258._8_4_;
  auVar244._12_4_ = auVar54._12_4_ * auVar258._12_4_;
  auVar57 = vsubps_avx512vl(auVar50,auVar244);
  auVar60 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar60 = vmulps_avx512vl(auVar60,auVar258);
  auVar153._0_4_ = auVar60._0_4_ + auVar54._0_4_ * fVar109 * auVar40._0_4_ * fVar101;
  auVar153._4_4_ = auVar60._4_4_ + auVar54._4_4_ * fVar109 * auVar40._4_4_ * fVar101;
  auVar153._8_4_ = auVar60._8_4_ + auVar54._8_4_ * fVar109 * auVar40._8_4_ * fVar101;
  auVar153._12_4_ = auVar60._12_4_ + auVar54._12_4_ * fVar109 * auVar40._12_4_ * fVar101;
  auVar40 = vsubps_avx(auVar58,auVar153);
  auVar54 = vaddps_avx512vl(auVar50,auVar244);
  auVar154._0_4_ = auVar58._0_4_ + auVar153._0_4_;
  auVar154._4_4_ = auVar58._4_4_ + auVar153._4_4_;
  auVar154._8_4_ = auVar58._8_4_ + auVar153._8_4_;
  auVar154._12_4_ = auVar58._12_4_ + auVar153._12_4_;
  auVar39 = vmulps_avx512vl(auVar39,auVar43);
  auVar170._0_4_ = auVar59._0_4_ + auVar39._0_4_;
  auVar170._4_4_ = auVar59._4_4_ + auVar39._4_4_;
  auVar170._8_4_ = auVar59._8_4_ + auVar39._8_4_;
  auVar170._12_4_ = auVar59._12_4_ + auVar39._12_4_;
  auVar39 = vmulps_avx512vl(auVar40,auVar43);
  auVar39 = vsubps_avx(auVar57,auVar39);
  auVar40 = vmulps_avx512vl(auVar112,auVar43);
  auVar113._0_4_ = auVar53._0_4_ + auVar40._0_4_;
  auVar113._4_4_ = auVar53._4_4_ + auVar40._4_4_;
  auVar113._8_4_ = auVar53._8_4_ + auVar40._8_4_;
  auVar113._12_4_ = auVar53._12_4_ + auVar40._12_4_;
  auVar40 = vmulps_avx512vl(auVar154,auVar43);
  auVar40 = vsubps_avx(auVar54,auVar40);
  auVar58 = vbroadcastss_avx512vl(auVar42);
  auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
  auVar259._0_4_ = auVar60._0_4_;
  auVar259._4_4_ = auVar259._0_4_;
  auVar259._8_4_ = auVar259._0_4_;
  auVar259._12_4_ = auVar259._0_4_;
  auVar59 = vmulps_avx512vl(auVar58,auVar59);
  auVar60 = vmulps_avx512vl(auVar58,auVar170);
  auVar39 = vmulps_avx512vl(auVar58,auVar39);
  auVar251._0_4_ = auVar58._0_4_ * auVar57._0_4_;
  auVar251._4_4_ = auVar58._4_4_ * auVar57._4_4_;
  auVar251._8_4_ = auVar58._8_4_ * auVar57._8_4_;
  auVar251._12_4_ = auVar58._12_4_ * auVar57._12_4_;
  local_320 = vfmadd231ps_avx512vl(auVar59,auVar259,auVar44);
  local_330 = vfmadd231ps_avx512vl(auVar60,auVar259,auVar180);
  local_340 = vfmadd231ps_avx512vl(auVar39,auVar259,auVar41);
  local_350 = vfmadd231ps_fma(auVar251,auVar259,auVar46);
  auVar39 = vmulps_avx512vl(auVar58,auVar53);
  auVar53 = vmulps_avx512vl(auVar58,auVar113);
  auVar40 = vmulps_avx512vl(auVar58,auVar40);
  auVar245._0_4_ = auVar58._0_4_ * auVar54._0_4_;
  auVar245._4_4_ = auVar58._4_4_ * auVar54._4_4_;
  auVar245._8_4_ = auVar58._8_4_ * auVar54._8_4_;
  auVar245._12_4_ = auVar58._12_4_ * auVar54._12_4_;
  _local_360 = vfmadd231ps_avx512vl(auVar39,auVar259,auVar45);
  _local_370 = vfmadd231ps_avx512vl(auVar53,auVar259,auVar48);
  _local_380 = vfmadd231ps_avx512vl(auVar40,auVar259,auVar49);
  _local_390 = vfmadd231ps_fma(auVar245,auVar259,auVar47);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2a0 = vsubps_avx512vl(local_320,auVar39);
  uVar102 = local_2a0._0_4_;
  auVar114._4_4_ = uVar102;
  auVar114._0_4_ = uVar102;
  auVar114._8_4_ = uVar102;
  auVar114._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar53 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar101 = pre->ray_space[k].vz.field_0.m128[0];
  fVar109 = pre->ray_space[k].vz.field_0.m128[1];
  fVar234 = pre->ray_space[k].vz.field_0.m128[2];
  fVar218 = pre->ray_space[k].vz.field_0.m128[3];
  auVar104._0_4_ = fVar101 * auVar53._0_4_;
  auVar104._4_4_ = fVar109 * auVar53._4_4_;
  auVar104._8_4_ = fVar234 * auVar53._8_4_;
  auVar104._12_4_ = fVar218 * auVar53._12_4_;
  auVar40 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar40);
  auVar60 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar114);
  local_2b0 = vsubps_avx512vl(local_330,auVar39);
  uVar102 = local_2b0._0_4_;
  auVar126._4_4_ = uVar102;
  auVar126._0_4_ = uVar102;
  auVar126._8_4_ = uVar102;
  auVar126._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar53 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar115._0_4_ = fVar101 * auVar53._0_4_;
  auVar115._4_4_ = fVar109 * auVar53._4_4_;
  auVar115._8_4_ = fVar234 * auVar53._8_4_;
  auVar115._12_4_ = fVar218 * auVar53._12_4_;
  auVar40 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar3,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar126);
  local_2c0 = vsubps_avx512vl(local_340,auVar39);
  uVar102 = local_2c0._0_4_;
  auVar127._4_4_ = uVar102;
  auVar127._0_4_ = uVar102;
  auVar127._8_4_ = uVar102;
  auVar127._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar53 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar192._0_4_ = auVar53._0_4_ * fVar101;
  auVar192._4_4_ = auVar53._4_4_ * fVar109;
  auVar192._8_4_ = auVar53._8_4_ * fVar234;
  auVar192._12_4_ = auVar53._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar127);
  local_2d0 = vsubps_avx(local_350,auVar39);
  uVar102 = local_2d0._0_4_;
  auVar128._4_4_ = uVar102;
  auVar128._0_4_ = uVar102;
  auVar128._8_4_ = uVar102;
  auVar128._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar53 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar200._0_4_ = auVar53._0_4_ * fVar101;
  auVar200._4_4_ = auVar53._4_4_ * fVar109;
  auVar200._8_4_ = auVar53._8_4_ * fVar234;
  auVar200._12_4_ = auVar53._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar3,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar128);
  local_2e0 = vsubps_avx512vl(_local_360,auVar39);
  uVar102 = local_2e0._0_4_;
  auVar129._4_4_ = uVar102;
  auVar129._0_4_ = uVar102;
  auVar129._8_4_ = uVar102;
  auVar129._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar53 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar211._0_4_ = auVar53._0_4_ * fVar101;
  auVar211._4_4_ = auVar53._4_4_ * fVar109;
  auVar211._8_4_ = auVar53._8_4_ * fVar234;
  auVar211._12_4_ = auVar53._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar3,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar129);
  local_2f0 = vsubps_avx512vl(_local_370,auVar39);
  uVar102 = local_2f0._0_4_;
  auVar130._4_4_ = uVar102;
  auVar130._0_4_ = uVar102;
  auVar130._8_4_ = uVar102;
  auVar130._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar53 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar219._0_4_ = auVar53._0_4_ * fVar101;
  auVar219._4_4_ = auVar53._4_4_ * fVar109;
  auVar219._8_4_ = auVar53._8_4_ * fVar234;
  auVar219._12_4_ = auVar53._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar3,auVar40);
  auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar130);
  local_300 = vsubps_avx512vl(_local_380,auVar39);
  uVar102 = local_300._0_4_;
  auVar131._4_4_ = uVar102;
  auVar131._0_4_ = uVar102;
  auVar131._8_4_ = uVar102;
  auVar131._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_300,local_300,0x55);
  auVar53 = vshufps_avx(local_300,local_300,0xaa);
  auVar236._0_4_ = auVar53._0_4_ * fVar101;
  auVar236._4_4_ = auVar53._4_4_ * fVar109;
  auVar236._8_4_ = auVar53._8_4_ * fVar234;
  auVar236._12_4_ = auVar53._12_4_ * fVar218;
  auVar40 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar3,auVar40);
  auVar46 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar131);
  local_310 = vsubps_avx(_local_390,auVar39);
  uVar102 = local_310._0_4_;
  auVar118._4_4_ = uVar102;
  auVar118._0_4_ = uVar102;
  auVar118._8_4_ = uVar102;
  auVar118._12_4_ = uVar102;
  auVar39 = vshufps_avx(local_310,local_310,0x55);
  auVar40 = vshufps_avx(local_310,local_310,0xaa);
  auVar171._0_4_ = fVar101 * auVar40._0_4_;
  auVar171._4_4_ = fVar109 * auVar40._4_4_;
  auVar171._8_4_ = fVar234 * auVar40._8_4_;
  auVar171._12_4_ = fVar218 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar3,auVar39);
  auVar47 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar118);
  auVar59 = vmovlhps_avx512f(auVar60,auVar43);
  auVar53 = vmovlhps_avx(auVar41,auVar45);
  auVar54 = vmovlhps_avx(auVar44,auVar46);
  auVar58 = vmovlhps_avx(auVar42,auVar47);
  auVar40 = vminps_avx512vl(auVar59,auVar53);
  auVar57 = vmaxps_avx512vl(auVar59,auVar53);
  auVar39 = vminps_avx(auVar54,auVar58);
  auVar40 = vminps_avx(auVar40,auVar39);
  auVar39 = vmaxps_avx(auVar54,auVar58);
  auVar39 = vmaxps_avx(auVar57,auVar39);
  auVar57 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vminps_avx(auVar40,auVar57);
  auVar57 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vmaxps_avx(auVar39,auVar57);
  auVar40 = vandps_avx512vl(auVar40,auVar270._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar270._0_16_);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar40 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar40,auVar39);
  fVar109 = auVar39._0_4_ * 9.536743e-07;
  auVar40 = vmovddup_avx512vl(auVar60);
  auVar57 = vmovddup_avx512vl(auVar41);
  auVar193._0_8_ = auVar44._0_8_;
  auVar193._8_8_ = auVar193._0_8_;
  auVar201._0_8_ = auVar42._0_8_;
  auVar201._8_8_ = auVar201._0_8_;
  local_240 = vbroadcastss_avx512vl(ZEXT416((uint)fVar109));
  auVar39 = vxorps_avx512vl(local_240._0_16_,auVar56);
  local_260 = vbroadcastss_avx512vl(auVar39);
  bVar32 = false;
  uVar26 = 0;
  fVar101 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx512vl(auVar53,auVar59);
  local_280 = vsubps_avx(auVar54,auVar53);
  local_290 = vsubps_avx(auVar58,auVar54);
  local_3b0 = vsubps_avx512vl(_local_360,local_320);
  local_3c0 = vsubps_avx512vl(_local_370,local_330);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  _local_3e0 = vsubps_avx(_local_390,local_350);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar39 = ZEXT816(0x3f80000000000000);
  auVar116 = auVar39;
LAB_01c03efa:
  do {
    auVar60 = vshufps_avx(auVar116,auVar116,0x50);
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = 0x3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar256._16_4_ = 0x3f800000;
    auVar256._0_16_ = auVar252;
    auVar256._20_4_ = 0x3f800000;
    auVar256._24_4_ = 0x3f800000;
    auVar256._28_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar252,auVar60);
    fVar234 = auVar60._0_4_;
    fVar137 = auVar43._0_4_;
    auVar139._0_4_ = fVar137 * fVar234;
    fVar218 = auVar60._4_4_;
    fVar145 = auVar43._4_4_;
    auVar139._4_4_ = fVar145 * fVar218;
    fVar229 = auVar60._8_4_;
    auVar139._8_4_ = fVar137 * fVar229;
    fVar230 = auVar60._12_4_;
    auVar139._12_4_ = fVar145 * fVar230;
    fVar210 = auVar45._0_4_;
    auVar155._0_4_ = fVar210 * fVar234;
    fVar216 = auVar45._4_4_;
    auVar155._4_4_ = fVar216 * fVar218;
    auVar155._8_4_ = fVar210 * fVar229;
    auVar155._12_4_ = fVar216 * fVar230;
    fVar217 = auVar46._0_4_;
    auVar172._0_4_ = fVar217 * fVar234;
    fVar228 = auVar46._4_4_;
    auVar172._4_4_ = fVar228 * fVar218;
    auVar172._8_4_ = fVar217 * fVar229;
    auVar172._12_4_ = fVar228 * fVar230;
    fVar235 = auVar47._0_4_;
    auVar119._0_4_ = fVar235 * fVar234;
    fVar243 = auVar47._4_4_;
    auVar119._4_4_ = fVar243 * fVar218;
    auVar119._8_4_ = fVar235 * fVar229;
    auVar119._12_4_ = fVar243 * fVar230;
    auVar42 = vfmadd231ps_avx512vl(auVar139,auVar41,auVar40);
    auVar48 = vfmadd231ps_avx512vl(auVar155,auVar41,auVar57);
    auVar44 = vfmadd231ps_fma(auVar172,auVar41,auVar193);
    auVar41 = vfmadd231ps_fma(auVar119,auVar201,auVar41);
    auVar60 = vmovshdup_avx(auVar39);
    fVar218 = auVar39._0_4_;
    fVar234 = (auVar60._0_4_ - fVar218) * 0.04761905;
    auVar143._4_4_ = fVar218;
    auVar143._0_4_ = fVar218;
    auVar143._8_4_ = fVar218;
    auVar143._12_4_ = fVar218;
    auVar143._16_4_ = fVar218;
    auVar143._20_4_ = fVar218;
    auVar143._24_4_ = fVar218;
    auVar143._28_4_ = fVar218;
    auVar78._0_8_ = auVar60._0_8_;
    auVar78._8_8_ = auVar78._0_8_;
    auVar78._16_8_ = auVar78._0_8_;
    auVar78._24_8_ = auVar78._0_8_;
    auVar68 = vsubps_avx(auVar78,auVar143);
    uVar102 = auVar42._0_4_;
    auVar88._4_4_ = uVar102;
    auVar88._0_4_ = uVar102;
    auVar88._8_4_ = uVar102;
    auVar88._12_4_ = uVar102;
    auVar88._16_4_ = uVar102;
    auVar88._20_4_ = uVar102;
    auVar88._24_4_ = uVar102;
    auVar88._28_4_ = uVar102;
    auVar79._8_4_ = 1;
    auVar79._0_8_ = 0x100000001;
    auVar79._12_4_ = 1;
    auVar79._16_4_ = 1;
    auVar79._20_4_ = 1;
    auVar79._24_4_ = 1;
    auVar79._28_4_ = 1;
    auVar86 = ZEXT1632(auVar42);
    auVar84 = vpermps_avx2(auVar79,auVar86);
    auVar69 = vbroadcastss_avx512vl(auVar48);
    auVar85 = ZEXT1632(auVar48);
    auVar70 = vpermps_avx512vl(auVar79,auVar85);
    auVar71 = vbroadcastss_avx512vl(auVar44);
    auVar80 = ZEXT1632(auVar44);
    auVar72 = vpermps_avx512vl(auVar79,auVar80);
    auVar73 = vbroadcastss_avx512vl(auVar41);
    auVar83 = ZEXT1632(auVar41);
    auVar74 = vpermps_avx512vl(auVar79,auVar83);
    auVar214._4_4_ = fVar234;
    auVar214._0_4_ = fVar234;
    auVar214._8_4_ = fVar234;
    auVar214._12_4_ = fVar234;
    auVar214._16_4_ = fVar234;
    auVar214._20_4_ = fVar234;
    auVar214._24_4_ = fVar234;
    auVar214._28_4_ = fVar234;
    auVar81._8_4_ = 2;
    auVar81._0_8_ = 0x200000002;
    auVar81._12_4_ = 2;
    auVar81._16_4_ = 2;
    auVar81._20_4_ = 2;
    auVar81._24_4_ = 2;
    auVar81._28_4_ = 2;
    auVar75 = vpermps_avx512vl(auVar81,auVar86);
    auVar76 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar77 = vpermps_avx512vl(auVar76,auVar86);
    auVar78 = vpermps_avx512vl(auVar81,auVar85);
    auVar79 = vpermps_avx512vl(auVar76,auVar85);
    auVar86 = vpermps_avx2(auVar81,auVar80);
    auVar80 = vpermps_avx512vl(auVar76,auVar80);
    auVar81 = vpermps_avx512vl(auVar81,auVar83);
    auVar82 = vpermps_avx512vl(auVar76,auVar83);
    auVar60 = vfmadd132ps_fma(auVar68,auVar143,_DAT_01faff20);
    auVar68 = vsubps_avx(auVar256,ZEXT1632(auVar60));
    auVar76 = vmulps_avx512vl(auVar69,ZEXT1632(auVar60));
    auVar85 = ZEXT1632(auVar60);
    auVar83 = vmulps_avx512vl(auVar70,auVar85);
    auVar41 = vfmadd231ps_fma(auVar76,auVar68,auVar88);
    auVar44 = vfmadd231ps_fma(auVar83,auVar68,auVar84);
    auVar76 = vmulps_avx512vl(auVar71,auVar85);
    auVar83 = vmulps_avx512vl(auVar72,auVar85);
    auVar69 = vfmadd231ps_avx512vl(auVar76,auVar68,auVar69);
    auVar70 = vfmadd231ps_avx512vl(auVar83,auVar68,auVar70);
    auVar76 = vmulps_avx512vl(auVar73,auVar85);
    auVar88 = ZEXT1632(auVar60);
    auVar74 = vmulps_avx512vl(auVar74,auVar88);
    auVar71 = vfmadd231ps_avx512vl(auVar76,auVar68,auVar71);
    auVar72 = vfmadd231ps_avx512vl(auVar74,auVar68,auVar72);
    fVar229 = auVar60._0_4_;
    fVar230 = auVar60._4_4_;
    auVar74._4_4_ = fVar230 * auVar69._4_4_;
    auVar74._0_4_ = fVar229 * auVar69._0_4_;
    fVar231 = auVar60._8_4_;
    auVar74._8_4_ = fVar231 * auVar69._8_4_;
    fVar232 = auVar60._12_4_;
    auVar74._12_4_ = fVar232 * auVar69._12_4_;
    auVar74._16_4_ = auVar69._16_4_ * 0.0;
    auVar74._20_4_ = auVar69._20_4_ * 0.0;
    auVar74._24_4_ = auVar69._24_4_ * 0.0;
    auVar74._28_4_ = fVar218;
    auVar76._4_4_ = fVar230 * auVar70._4_4_;
    auVar76._0_4_ = fVar229 * auVar70._0_4_;
    auVar76._8_4_ = fVar231 * auVar70._8_4_;
    auVar76._12_4_ = fVar232 * auVar70._12_4_;
    auVar76._16_4_ = auVar70._16_4_ * 0.0;
    auVar76._20_4_ = auVar70._20_4_ * 0.0;
    auVar76._24_4_ = auVar70._24_4_ * 0.0;
    auVar76._28_4_ = auVar84._28_4_;
    auVar41 = vfmadd231ps_fma(auVar74,auVar68,ZEXT1632(auVar41));
    auVar44 = vfmadd231ps_fma(auVar76,auVar68,ZEXT1632(auVar44));
    auVar87._0_4_ = fVar229 * auVar71._0_4_;
    auVar87._4_4_ = fVar230 * auVar71._4_4_;
    auVar87._8_4_ = fVar231 * auVar71._8_4_;
    auVar87._12_4_ = fVar232 * auVar71._12_4_;
    auVar87._16_4_ = auVar71._16_4_ * 0.0;
    auVar87._20_4_ = auVar71._20_4_ * 0.0;
    auVar87._24_4_ = auVar71._24_4_ * 0.0;
    auVar87._28_4_ = 0;
    auVar83._4_4_ = fVar230 * auVar72._4_4_;
    auVar83._0_4_ = fVar229 * auVar72._0_4_;
    auVar83._8_4_ = fVar231 * auVar72._8_4_;
    auVar83._12_4_ = fVar232 * auVar72._12_4_;
    auVar83._16_4_ = auVar72._16_4_ * 0.0;
    auVar83._20_4_ = auVar72._20_4_ * 0.0;
    auVar83._24_4_ = auVar72._24_4_ * 0.0;
    auVar83._28_4_ = auVar71._28_4_;
    auVar42 = vfmadd231ps_fma(auVar87,auVar68,auVar69);
    auVar48 = vfmadd231ps_fma(auVar83,auVar68,auVar70);
    auVar85._28_4_ = auVar70._28_4_;
    auVar85._0_28_ =
         ZEXT1628(CONCAT412(fVar232 * auVar48._12_4_,
                            CONCAT48(fVar231 * auVar48._8_4_,
                                     CONCAT44(fVar230 * auVar48._4_4_,fVar229 * auVar48._0_4_))));
    auVar49 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar232 * auVar42._12_4_,
                                                 CONCAT48(fVar231 * auVar42._8_4_,
                                                          CONCAT44(fVar230 * auVar42._4_4_,
                                                                   fVar229 * auVar42._0_4_)))),
                              auVar68,ZEXT1632(auVar41));
    auVar50 = vfmadd231ps_fma(auVar85,auVar68,ZEXT1632(auVar44));
    auVar84 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar41));
    auVar69 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar44));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar84 = vmulps_avx512vl(auVar84,auVar70);
    auVar69 = vmulps_avx512vl(auVar69,auVar70);
    auVar161._0_4_ = fVar234 * auVar84._0_4_;
    auVar161._4_4_ = fVar234 * auVar84._4_4_;
    auVar161._8_4_ = fVar234 * auVar84._8_4_;
    auVar161._12_4_ = fVar234 * auVar84._12_4_;
    auVar161._16_4_ = fVar234 * auVar84._16_4_;
    auVar161._20_4_ = fVar234 * auVar84._20_4_;
    auVar161._24_4_ = fVar234 * auVar84._24_4_;
    auVar161._28_4_ = 0;
    auVar84 = vmulps_avx512vl(auVar214,auVar69);
    auVar44 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar49),_DAT_01feed00,ZEXT1632(auVar44));
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_01feed00,ZEXT1632(auVar44));
    auVar124._0_4_ = auVar161._0_4_ + auVar49._0_4_;
    auVar124._4_4_ = auVar161._4_4_ + auVar49._4_4_;
    auVar124._8_4_ = auVar161._8_4_ + auVar49._8_4_;
    auVar124._12_4_ = auVar161._12_4_ + auVar49._12_4_;
    auVar124._16_4_ = auVar161._16_4_ + 0.0;
    auVar124._20_4_ = auVar161._20_4_ + 0.0;
    auVar124._24_4_ = auVar161._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar87 = ZEXT1632(auVar44);
    auVar72 = vpermt2ps_avx512vl(auVar161,_DAT_01feed00,auVar87);
    auVar73 = vaddps_avx512vl(ZEXT1632(auVar50),auVar84);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar87);
    auVar84 = vsubps_avx(auVar69,auVar72);
    auVar72 = vsubps_avx512vl(auVar71,auVar74);
    auVar74 = vmulps_avx512vl(auVar78,auVar88);
    auVar76 = vmulps_avx512vl(auVar79,auVar88);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar68,auVar75);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar68,auVar77);
    auVar83 = vmulps_avx512vl(auVar86,auVar88);
    auVar85 = vmulps_avx512vl(auVar80,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar68,auVar78);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar68,auVar79);
    auVar75 = vmulps_avx512vl(auVar81,auVar88);
    auVar77 = vmulps_avx512vl(auVar82,auVar88);
    auVar41 = vfmadd231ps_fma(auVar75,auVar68,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar77,auVar68,auVar80);
    auVar75 = vmulps_avx512vl(auVar88,auVar83);
    auVar78 = ZEXT1632(auVar60);
    auVar77 = vmulps_avx512vl(auVar78,auVar85);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar68,auVar74);
    auVar76 = vfmadd231ps_avx512vl(auVar77,auVar68,auVar76);
    auVar86 = vmulps_avx512vl(auVar78,auVar86);
    auVar83 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar232 * auVar41._12_4_,
                                            CONCAT48(fVar231 * auVar41._8_4_,
                                                     CONCAT44(fVar230 * auVar41._4_4_,
                                                              fVar229 * auVar41._0_4_)))),auVar68,
                         auVar83);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar68,auVar85);
    auVar75._4_4_ = fVar230 * auVar83._4_4_;
    auVar75._0_4_ = fVar229 * auVar83._0_4_;
    auVar75._8_4_ = fVar231 * auVar83._8_4_;
    auVar75._12_4_ = fVar232 * auVar83._12_4_;
    auVar75._16_4_ = auVar83._16_4_ * 0.0;
    auVar75._20_4_ = auVar83._20_4_ * 0.0;
    auVar75._24_4_ = auVar83._24_4_ * 0.0;
    auVar75._28_4_ = auVar80._28_4_;
    auVar85 = vmulps_avx512vl(auVar78,auVar86);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar68,auVar74);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar76,auVar68);
    auVar68 = vsubps_avx512vl(auVar83,auVar74);
    auVar86 = vsubps_avx512vl(auVar86,auVar76);
    auVar68 = vmulps_avx512vl(auVar68,auVar70);
    auVar86 = vmulps_avx512vl(auVar86,auVar70);
    fVar218 = fVar234 * auVar68._0_4_;
    fVar229 = fVar234 * auVar68._4_4_;
    auVar77._4_4_ = fVar229;
    auVar77._0_4_ = fVar218;
    fVar230 = fVar234 * auVar68._8_4_;
    auVar77._8_4_ = fVar230;
    fVar231 = fVar234 * auVar68._12_4_;
    auVar77._12_4_ = fVar231;
    fVar232 = fVar234 * auVar68._16_4_;
    auVar77._16_4_ = fVar232;
    fVar233 = fVar234 * auVar68._20_4_;
    auVar77._20_4_ = fVar233;
    fVar234 = fVar234 * auVar68._24_4_;
    auVar77._24_4_ = fVar234;
    auVar77._28_4_ = auVar68._28_4_;
    auVar86 = vmulps_avx512vl(auVar214,auVar86);
    auVar70 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar87);
    auVar74 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar87);
    auVar215._0_4_ = auVar75._0_4_ + fVar218;
    auVar215._4_4_ = auVar75._4_4_ + fVar229;
    auVar215._8_4_ = auVar75._8_4_ + fVar230;
    auVar215._12_4_ = auVar75._12_4_ + fVar231;
    auVar215._16_4_ = auVar75._16_4_ + fVar232;
    auVar215._20_4_ = auVar75._20_4_ + fVar233;
    auVar215._24_4_ = auVar75._24_4_ + fVar234;
    auVar215._28_4_ = auVar75._28_4_ + auVar68._28_4_;
    auVar68 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,ZEXT1632(auVar44));
    auVar76 = vaddps_avx512vl(auVar85,auVar86);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,ZEXT1632(auVar44));
    auVar68 = vsubps_avx(auVar70,auVar68);
    auVar86 = vsubps_avx512vl(auVar74,auVar86);
    in_ZMM17 = ZEXT3264(auVar86);
    auVar143 = ZEXT1632(auVar49);
    auVar83 = vsubps_avx512vl(auVar75,auVar143);
    auVar161 = ZEXT1632(auVar50);
    auVar77 = vsubps_avx512vl(auVar85,auVar161);
    auVar78 = vsubps_avx512vl(auVar70,auVar69);
    auVar83 = vaddps_avx512vl(auVar83,auVar78);
    auVar78 = vsubps_avx512vl(auVar74,auVar71);
    auVar77 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vmulps_avx512vl(auVar161,auVar83);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar143,auVar77);
    auVar79 = vmulps_avx512vl(auVar73,auVar83);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar124,auVar77);
    auVar80 = vmulps_avx512vl(auVar72,auVar83);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar84,auVar77);
    auVar81 = vmulps_avx512vl(auVar71,auVar83);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar69,auVar77);
    auVar82 = vmulps_avx512vl(auVar85,auVar83);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar77);
    auVar87 = vmulps_avx512vl(auVar76,auVar83);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar215,auVar77);
    auVar88 = vmulps_avx512vl(auVar86,auVar83);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar68,auVar77);
    auVar83 = vmulps_avx512vl(auVar74,auVar83);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar70,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar79 = vminps_avx512vl(auVar82,auVar87);
    auVar80 = vmaxps_avx512vl(auVar82,auVar87);
    auVar81 = vminps_avx512vl(auVar88,auVar83);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar77 = vminps_avx512vl(auVar77,auVar79);
    auVar83 = vmaxps_avx512vl(auVar88,auVar83);
    auVar83 = vmaxps_avx512vl(auVar80,auVar83);
    auVar83 = vmaxps_avx512vl(auVar78,auVar83);
    uVar18 = vcmpps_avx512vl(auVar77,local_240,2);
    uVar19 = vcmpps_avx512vl(auVar83,local_260,5);
    bVar24 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar24 == 0) {
      auVar41 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    else {
      auVar83 = vsubps_avx512vl(auVar69,auVar143);
      auVar77 = vsubps_avx512vl(auVar71,auVar161);
      auVar78 = vsubps_avx512vl(auVar70,auVar75);
      auVar83 = vaddps_avx512vl(auVar83,auVar78);
      auVar78 = vsubps_avx512vl(auVar74,auVar85);
      auVar77 = vaddps_avx512vl(auVar77,auVar78);
      auVar78 = vmulps_avx512vl(auVar161,auVar83);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar77,auVar143);
      auVar73 = vmulps_avx512vl(auVar73,auVar83);
      auVar73 = vfnmadd213ps_avx512vl(auVar124,auVar77,auVar73);
      auVar72 = vmulps_avx512vl(auVar72,auVar83);
      auVar72 = vfnmadd213ps_avx512vl(auVar84,auVar77,auVar72);
      auVar84 = vmulps_avx512vl(auVar71,auVar83);
      auVar71 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar69);
      auVar84 = vmulps_avx512vl(auVar85,auVar83);
      auVar85 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar75);
      auVar84 = vmulps_avx512vl(auVar76,auVar83);
      auVar76 = vfnmadd213ps_avx512vl(auVar215,auVar77,auVar84);
      auVar84 = vmulps_avx512vl(auVar86,auVar83);
      auVar75 = vfnmadd213ps_avx512vl(auVar68,auVar77,auVar84);
      auVar68 = vmulps_avx512vl(auVar74,auVar83);
      auVar74 = vfnmadd231ps_avx512vl(auVar68,auVar70,auVar77);
      auVar84 = vminps_avx(auVar78,auVar73);
      auVar68 = vmaxps_avx(auVar78,auVar73);
      auVar69 = vminps_avx(auVar72,auVar71);
      auVar69 = vminps_avx(auVar84,auVar69);
      auVar84 = vmaxps_avx(auVar72,auVar71);
      auVar68 = vmaxps_avx(auVar68,auVar84);
      auVar86 = vminps_avx(auVar85,auVar76);
      auVar84 = vmaxps_avx(auVar85,auVar76);
      auVar70 = vminps_avx(auVar75,auVar74);
      auVar86 = vminps_avx(auVar86,auVar70);
      auVar86 = vminps_avx(auVar69,auVar86);
      auVar69 = vmaxps_avx(auVar75,auVar74);
      auVar84 = vmaxps_avx(auVar84,auVar69);
      auVar68 = vmaxps_avx(auVar68,auVar84);
      uVar18 = vcmpps_avx512vl(auVar68,local_260,5);
      uVar19 = vcmpps_avx512vl(auVar86,local_240,2);
      bVar24 = bVar24 & (byte)uVar18 & (byte)uVar19;
      if (bVar24 != 0) {
        auStack_440[uVar26] = (uint)bVar24;
        uVar18 = vmovlps_avx(auVar39);
        (&uStack_220)[uVar26] = uVar18;
        uVar1 = vmovlps_avx(auVar116);
        auStack_1a0[uVar26] = uVar1;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
      auVar41 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    in_ZMM28 = ZEXT1664(_DAT_01feecd0);
    auVar269 = ZEXT1664(auVar39);
    auVar268 = ZEXT3264(_DAT_01feed20);
    auVar267 = ZEXT1664(auVar60);
    auVar266 = ZEXT3264(auVar68);
    auVar265 = ZEXT1664(auVar41);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar272 = ZEXT1664(auVar39);
LAB_01c0446e:
    do {
      do {
        do {
          auVar60 = auVar265._0_16_;
          if ((int)uVar26 == 0) {
            if (bVar32 != false) {
              return bVar32;
            }
            uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar23._4_4_ = uVar102;
            auVar23._0_4_ = uVar102;
            auVar23._8_4_ = uVar102;
            auVar23._12_4_ = uVar102;
            uVar18 = vcmpps_avx512vl(local_3a0,auVar23,2);
            uVar33 = (uint)uVar38 & (uint)uVar38 + 0xf & (uint)uVar18;
            uVar38 = (ulong)uVar33;
            if (uVar33 == 0) {
              return false;
            }
            goto LAB_01c03384;
          }
          uVar25 = (int)uVar26 - 1;
          uVar27 = (ulong)uVar25;
          uVar5 = auStack_440[uVar27];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = auStack_1a0[uVar27];
          uVar1 = 0;
          for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            uVar1 = uVar1 + 1;
          }
          uVar30 = uVar5 - 1 & uVar5;
          bVar36 = uVar30 == 0;
          auStack_440[uVar27] = uVar30;
          if (bVar36) {
            uVar26 = (ulong)uVar25;
          }
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar1;
          auVar39 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar1 + 1));
          auVar39 = vcvtqq2ps_avx512vl(auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar267._0_16_);
          uVar102 = *(undefined4 *)((long)&uStack_220 + uVar27 * 8 + 4);
          auVar20._4_4_ = uVar102;
          auVar20._0_4_ = uVar102;
          auVar20._8_4_ = uVar102;
          auVar20._12_4_ = uVar102;
          auVar41 = vmulps_avx512vl(auVar39,auVar20);
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar132,auVar39);
          uVar102 = *(undefined4 *)(&uStack_220 + uVar27);
          auVar21._4_4_ = uVar102;
          auVar21._0_4_ = uVar102;
          auVar21._8_4_ = uVar102;
          auVar21._12_4_ = uVar102;
          auVar39 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar21);
          auVar41 = vmovshdup_avx(auVar39);
          fVar234 = auVar41._0_4_ - auVar39._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar234));
          if (uVar5 == 0 || bVar36) goto LAB_01c03efa;
          auVar41 = vshufps_avx(auVar116,auVar116,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar234));
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar140,auVar41);
          fVar218 = auVar41._0_4_;
          auVar156._0_4_ = fVar218 * fVar137;
          fVar229 = auVar41._4_4_;
          auVar156._4_4_ = fVar229 * fVar145;
          fVar230 = auVar41._8_4_;
          auVar156._8_4_ = fVar230 * fVar137;
          fVar231 = auVar41._12_4_;
          auVar156._12_4_ = fVar231 * fVar145;
          auVar173._0_4_ = fVar218 * fVar210;
          auVar173._4_4_ = fVar229 * fVar216;
          auVar173._8_4_ = fVar230 * fVar210;
          auVar173._12_4_ = fVar231 * fVar216;
          auVar181._0_4_ = fVar218 * fVar217;
          auVar181._4_4_ = fVar229 * fVar228;
          auVar181._8_4_ = fVar230 * fVar217;
          auVar181._12_4_ = fVar231 * fVar228;
          auVar133._0_4_ = fVar218 * fVar235;
          auVar133._4_4_ = fVar229 * fVar243;
          auVar133._8_4_ = fVar230 * fVar235;
          auVar133._12_4_ = fVar231 * fVar243;
          auVar41 = vfmadd231ps_fma(auVar156,auVar44,auVar40);
          auVar42 = vfmadd231ps_fma(auVar173,auVar44,auVar57);
          auVar48 = vfmadd231ps_fma(auVar181,auVar44,auVar193);
          auVar44 = vfmadd231ps_fma(auVar133,auVar44,auVar201);
          auVar82._16_16_ = auVar41;
          auVar82._0_16_ = auVar41;
          auVar162._16_16_ = auVar42;
          auVar162._0_16_ = auVar42;
          auVar177._16_16_ = auVar48;
          auVar177._0_16_ = auVar48;
          auVar84 = vpermps_avx512vl(auVar268._0_32_,ZEXT1632(auVar39));
          auVar68 = vsubps_avx(auVar162,auVar82);
          auVar42 = vfmadd213ps_fma(auVar68,auVar84,auVar82);
          auVar68 = vsubps_avx(auVar177,auVar162);
          auVar49 = vfmadd213ps_fma(auVar68,auVar84,auVar162);
          auVar41 = vsubps_avx(auVar44,auVar48);
          auVar163._16_16_ = auVar41;
          auVar163._0_16_ = auVar41;
          auVar41 = vfmadd213ps_fma(auVar163,auVar84,auVar177);
          auVar68 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar42));
          auVar44 = vfmadd213ps_fma(auVar68,auVar84,ZEXT1632(auVar42));
          auVar68 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar49));
          auVar41 = vfmadd213ps_fma(auVar68,auVar84,ZEXT1632(auVar49));
          auVar68 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar44));
          auVar67 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar68,auVar84);
          auVar68 = vmulps_avx512vl(auVar68,auVar266._0_32_);
          auVar80._16_16_ = auVar68._16_16_;
          auVar41 = vmulss_avx512f(ZEXT416((uint)fVar234),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar218 = auVar41._0_4_;
          auVar182._0_8_ =
               CONCAT44(auVar67._4_4_ + fVar218 * auVar68._4_4_,
                        auVar67._0_4_ + fVar218 * auVar68._0_4_);
          auVar182._8_4_ = auVar67._8_4_ + fVar218 * auVar68._8_4_;
          auVar182._12_4_ = auVar67._12_4_ + fVar218 * auVar68._12_4_;
          auVar157._0_4_ = fVar218 * auVar68._16_4_;
          auVar157._4_4_ = fVar218 * auVar68._20_4_;
          auVar157._8_4_ = fVar218 * auVar68._24_4_;
          auVar157._12_4_ = fVar218 * auVar68._28_4_;
          auVar55 = vsubps_avx((undefined1  [16])0x0,auVar157);
          auVar49 = vshufpd_avx(auVar67,auVar67,3);
          auVar50 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar41 = vsubps_avx(auVar49,auVar67);
          auVar44 = vsubps_avx(auVar50,(undefined1  [16])0x0);
          auVar202._0_4_ = auVar41._0_4_ + auVar44._0_4_;
          auVar202._4_4_ = auVar41._4_4_ + auVar44._4_4_;
          auVar202._8_4_ = auVar41._8_4_ + auVar44._8_4_;
          auVar202._12_4_ = auVar41._12_4_ + auVar44._12_4_;
          auVar41 = vshufps_avx(auVar67,auVar67,0xb1);
          auVar44 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar42 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar253._4_4_ = auVar202._0_4_;
          auVar253._0_4_ = auVar202._0_4_;
          auVar253._8_4_ = auVar202._0_4_;
          auVar253._12_4_ = auVar202._0_4_;
          auVar51 = vshufps_avx(auVar202,auVar202,0x55);
          fVar218 = auVar51._0_4_;
          auVar212._0_4_ = auVar41._0_4_ * fVar218;
          fVar229 = auVar51._4_4_;
          auVar212._4_4_ = auVar41._4_4_ * fVar229;
          fVar230 = auVar51._8_4_;
          auVar212._8_4_ = auVar41._8_4_ * fVar230;
          fVar231 = auVar51._12_4_;
          auVar212._12_4_ = auVar41._12_4_ * fVar231;
          auVar220._0_4_ = auVar44._0_4_ * fVar218;
          auVar220._4_4_ = auVar44._4_4_ * fVar229;
          auVar220._8_4_ = auVar44._8_4_ * fVar230;
          auVar220._12_4_ = auVar44._12_4_ * fVar231;
          auVar237._0_4_ = auVar42._0_4_ * fVar218;
          auVar237._4_4_ = auVar42._4_4_ * fVar229;
          auVar237._8_4_ = auVar42._8_4_ * fVar230;
          auVar237._12_4_ = auVar42._12_4_ * fVar231;
          auVar203._0_4_ = auVar48._0_4_ * fVar218;
          auVar203._4_4_ = auVar48._4_4_ * fVar229;
          auVar203._8_4_ = auVar48._8_4_ * fVar230;
          auVar203._12_4_ = auVar48._12_4_ * fVar231;
          auVar41 = vfmadd231ps_fma(auVar212,auVar253,auVar67);
          auVar44 = vfmadd231ps_fma(auVar220,auVar253,auVar182);
          auVar56 = vfmadd231ps_fma(auVar237,auVar253,auVar55);
          auVar63 = vfmadd231ps_fma(auVar203,(undefined1  [16])0x0,auVar253);
          auVar51 = vshufpd_avx(auVar41,auVar41,1);
          auVar52 = vshufpd_avx(auVar44,auVar44,1);
          auVar61 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar62 = vshufpd_avx512vl(auVar63,auVar63,1);
          in_ZMM17 = ZEXT1664(auVar62);
          auVar42 = vminss_avx(auVar41,auVar44);
          auVar41 = vmaxss_avx(auVar44,auVar41);
          auVar48 = vminss_avx(auVar56,auVar63);
          auVar44 = vmaxss_avx(auVar63,auVar56);
          auVar42 = vminss_avx(auVar42,auVar48);
          auVar41 = vmaxss_avx(auVar44,auVar41);
          auVar48 = vminss_avx(auVar51,auVar52);
          auVar44 = vmaxss_avx(auVar52,auVar51);
          auVar51 = vminss_avx512f(auVar61,auVar62);
          auVar52 = vmaxss_avx512f(auVar62,auVar61);
          auVar44 = vmaxss_avx(auVar52,auVar44);
          auVar48 = vminss_avx512f(auVar48,auVar51);
          vucomiss_avx512f(auVar42);
          fVar229 = auVar44._0_4_;
          fVar218 = auVar41._0_4_;
          if (4 < (uint)uVar26) {
            bVar37 = fVar229 == -0.0001;
            bVar34 = NAN(fVar229);
            if (fVar229 <= -0.0001) goto LAB_01c046a5;
            break;
          }
LAB_01c046a5:
          auVar51 = vucomiss_avx512f(auVar48);
          bVar37 = fVar229 <= -0.0001;
          bVar35 = -0.0001 < fVar218;
          bVar34 = bVar37;
          if (!bVar37) break;
          uVar18 = vcmpps_avx512vl(auVar42,auVar51,5);
          uVar19 = vcmpps_avx512vl(auVar48,auVar51,5);
          bVar24 = (byte)uVar18 & (byte)uVar19 & 1;
          bVar37 = bVar35 && bVar24 == 0;
          bVar34 = bVar35 && bVar24 == 0;
        } while (!bVar35 || bVar24 != 0);
        vcmpss_avx512f(auVar42,auVar60,1);
        auVar56 = auVar271._0_16_;
        uVar18 = vcmpss_avx512f(auVar41,auVar60,1);
        bVar35 = (bool)((byte)uVar18 & 1);
        auVar80._0_16_ = auVar56;
        iVar100 = auVar271._0_4_;
        auVar89._4_28_ = auVar80._4_28_;
        auVar89._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar100);
        vucomiss_avx512f(auVar89._0_16_);
        bVar34 = (bool)(!bVar37 | bVar34);
        bVar35 = bVar34 == false;
        auVar91._16_16_ = auVar80._16_16_;
        auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar34 * auVar265._0_4_ + (uint)!bVar34 * 0x7f800000;
        auVar52 = auVar90._0_16_;
        auVar93._16_16_ = auVar80._16_16_;
        auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar34 * auVar265._0_4_ + (uint)!bVar34 * -0x800000;
        auVar51 = auVar92._0_16_;
        uVar18 = vcmpss_avx512f(auVar48,auVar60,1);
        bVar37 = (bool)((byte)uVar18 & 1);
        auVar95._16_16_ = auVar80._16_16_;
        auVar95._0_16_ = auVar56;
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar100);
        auVar48 = vucomiss_avx512f(auVar94._0_16_);
        in_ZMM17 = ZEXT1664(auVar48);
        if ((bVar34) || (bVar35)) {
          auVar48 = vucomiss_avx512f(auVar42);
          if ((bVar34) || (bVar35)) {
            auVar63 = vxorps_avx512vl(auVar42,auVar272._0_16_);
            in_ZMM17 = ZEXT1664(auVar63);
            auVar42 = vsubss_avx512f(auVar48,auVar42);
            auVar42 = vdivss_avx512f(auVar63,auVar42);
            auVar48 = vsubss_avx512f(auVar56,auVar42);
            auVar42 = vfmadd213ss_avx512f(auVar48,auVar60,auVar42);
            auVar48 = auVar42;
          }
          else {
            auVar48 = vxorps_avx512vl(auVar48,auVar48);
            vucomiss_avx512f(auVar48);
            if ((bVar34) || (auVar42 = auVar56, bVar35)) {
              auVar42 = SUB6416(ZEXT464(0xff800000),0);
              auVar48 = ZEXT416(0x7f800000);
            }
          }
          auVar52 = vminss_avx512f(auVar52,auVar48);
          auVar51 = vmaxss_avx(auVar42,auVar51);
        }
        uVar18 = vcmpss_avx512f(auVar44,auVar60,1);
        bVar37 = (bool)((byte)uVar18 & 1);
        fVar230 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar100);
        if ((auVar89._0_4_ != fVar230) || (NAN(auVar89._0_4_) || NAN(fVar230))) {
          if ((fVar229 != fVar218) || (NAN(fVar229) || NAN(fVar218))) {
            auVar41 = vxorps_avx512vl(auVar41,auVar272._0_16_);
            auVar204._0_4_ = auVar41._0_4_ / (fVar229 - fVar218);
            auVar204._4_12_ = auVar41._4_12_;
            auVar41 = vsubss_avx512f(auVar56,auVar204);
            auVar41 = vfmadd213ss_avx512f(auVar41,auVar60,auVar204);
            auVar44 = auVar41;
          }
          else if ((fVar218 != 0.0) ||
                  (auVar41 = auVar56, auVar44 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar218))) {
            auVar41 = SUB6416(ZEXT464(0xff800000),0);
            auVar44 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar52 = vminss_avx(auVar52,auVar44);
          auVar51 = vmaxss_avx(auVar41,auVar51);
        }
        bVar37 = auVar94._0_4_ != fVar230;
        auVar41 = vminss_avx512f(auVar52,auVar56);
        auVar97._16_16_ = auVar80._16_16_;
        auVar97._0_16_ = auVar52;
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (uint)bVar37 * auVar41._0_4_ + (uint)!bVar37 * auVar52._0_4_;
        auVar41 = vmaxss_avx512f(auVar56,auVar51);
        auVar99._16_16_ = auVar80._16_16_;
        auVar99._0_16_ = auVar51;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar37 * auVar41._0_4_ + (uint)!bVar37 * auVar51._0_4_;
        auVar41 = vmaxss_avx512f(auVar60,auVar96._0_16_);
        auVar44 = vminss_avx512f(auVar98._0_16_,auVar56);
      } while (auVar44._0_4_ < auVar41._0_4_);
      auVar63 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar41._0_4_ + -0.1)));
      auVar62 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar56);
      auVar134._0_8_ = auVar67._0_8_;
      auVar134._8_8_ = auVar134._0_8_;
      auVar221._8_8_ = auVar182._0_8_;
      auVar221._0_8_ = auVar182._0_8_;
      auVar238._8_8_ = auVar55._0_8_;
      auVar238._0_8_ = auVar55._0_8_;
      auVar41 = vshufpd_avx(auVar182,auVar182,3);
      auVar44 = vshufpd_avx(auVar55,auVar55,3);
      auVar42 = vshufps_avx(auVar63,auVar62,0);
      auVar254._8_4_ = 0x3f800000;
      auVar254._0_8_ = 0x3f8000003f800000;
      auVar254._12_4_ = 0x3f800000;
      auVar48 = vsubps_avx(auVar254,auVar42);
      fVar218 = auVar42._0_4_;
      auVar174._0_4_ = fVar218 * auVar49._0_4_;
      fVar229 = auVar42._4_4_;
      auVar174._4_4_ = fVar229 * auVar49._4_4_;
      fVar230 = auVar42._8_4_;
      auVar174._8_4_ = fVar230 * auVar49._8_4_;
      fVar231 = auVar42._12_4_;
      auVar174._12_4_ = fVar231 * auVar49._12_4_;
      auVar183._0_4_ = fVar218 * auVar41._0_4_;
      auVar183._4_4_ = fVar229 * auVar41._4_4_;
      auVar183._8_4_ = fVar230 * auVar41._8_4_;
      auVar183._12_4_ = fVar231 * auVar41._12_4_;
      auVar260._0_4_ = auVar44._0_4_ * fVar218;
      auVar260._4_4_ = auVar44._4_4_ * fVar229;
      auVar260._8_4_ = auVar44._8_4_ * fVar230;
      auVar260._12_4_ = auVar44._12_4_ * fVar231;
      auVar158._0_4_ = fVar218 * auVar50._0_4_;
      auVar158._4_4_ = fVar229 * auVar50._4_4_;
      auVar158._8_4_ = fVar230 * auVar50._8_4_;
      auVar158._12_4_ = fVar231 * auVar50._12_4_;
      auVar49 = vfmadd231ps_fma(auVar174,auVar48,auVar134);
      auVar50 = vfmadd231ps_fma(auVar183,auVar48,auVar221);
      auVar51 = vfmadd231ps_fma(auVar260,auVar48,auVar238);
      auVar52 = vfmadd231ps_fma(auVar158,auVar48,ZEXT816(0));
      auVar44 = vsubss_avx512f(auVar56,auVar63);
      auVar41 = vmovshdup_avx(auVar116);
      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar63._0_4_)),auVar116,auVar44);
      auVar44 = vsubss_avx512f(auVar56,auVar62);
      auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar62._0_4_)),auVar116,auVar44);
      auVar55 = vdivss_avx512f(auVar56,ZEXT416((uint)fVar234));
      auVar41 = vsubps_avx(auVar50,auVar49);
      auVar138 = auVar269._0_16_;
      auVar42 = vmulps_avx512vl(auVar41,auVar138);
      auVar41 = vsubps_avx(auVar51,auVar50);
      auVar48 = vmulps_avx512vl(auVar41,auVar138);
      auVar41 = vsubps_avx(auVar52,auVar51);
      auVar41 = vmulps_avx512vl(auVar41,auVar138);
      auVar44 = vminps_avx(auVar48,auVar41);
      auVar41 = vmaxps_avx(auVar48,auVar41);
      auVar44 = vminps_avx(auVar42,auVar44);
      auVar41 = vmaxps_avx(auVar42,auVar41);
      auVar42 = vshufpd_avx(auVar44,auVar44,3);
      auVar48 = vshufpd_avx(auVar41,auVar41,3);
      auVar44 = vminps_avx(auVar44,auVar42);
      auVar41 = vmaxps_avx(auVar41,auVar48);
      fVar234 = auVar55._0_4_;
      auVar205._0_4_ = auVar44._0_4_ * fVar234;
      auVar205._4_4_ = auVar44._4_4_ * fVar234;
      auVar205._8_4_ = auVar44._8_4_ * fVar234;
      auVar205._12_4_ = auVar44._12_4_ * fVar234;
      auVar194._0_4_ = fVar234 * auVar41._0_4_;
      auVar194._4_4_ = fVar234 * auVar41._4_4_;
      auVar194._8_4_ = fVar234 * auVar41._8_4_;
      auVar194._12_4_ = fVar234 * auVar41._12_4_;
      auVar55 = vdivss_avx512f(auVar56,ZEXT416((uint)(auVar62._0_4_ - auVar61._0_4_)));
      auVar41 = vshufpd_avx(auVar49,auVar49,3);
      auVar44 = vshufpd_avx(auVar50,auVar50,3);
      auVar42 = vshufpd_avx(auVar51,auVar51,3);
      auVar48 = vshufpd_avx(auVar52,auVar52,3);
      auVar41 = vsubps_avx(auVar41,auVar49);
      auVar49 = vsubps_avx(auVar44,auVar50);
      auVar50 = vsubps_avx(auVar42,auVar51);
      auVar48 = vsubps_avx(auVar48,auVar52);
      auVar44 = vminps_avx(auVar41,auVar49);
      auVar41 = vmaxps_avx(auVar41,auVar49);
      auVar42 = vminps_avx(auVar50,auVar48);
      auVar42 = vminps_avx(auVar44,auVar42);
      auVar44 = vmaxps_avx(auVar50,auVar48);
      auVar41 = vmaxps_avx(auVar41,auVar44);
      fVar234 = auVar55._0_4_;
      auVar239._0_4_ = fVar234 * auVar42._0_4_;
      auVar239._4_4_ = fVar234 * auVar42._4_4_;
      auVar239._8_4_ = fVar234 * auVar42._8_4_;
      auVar239._12_4_ = fVar234 * auVar42._12_4_;
      auVar222._0_4_ = fVar234 * auVar41._0_4_;
      auVar222._4_4_ = fVar234 * auVar41._4_4_;
      auVar222._8_4_ = fVar234 * auVar41._8_4_;
      auVar222._12_4_ = fVar234 * auVar41._12_4_;
      auVar48 = vinsertps_avx(auVar39,auVar61,0x10);
      auVar64 = vpermt2ps_avx512vl(auVar39,in_ZMM28._0_16_,auVar62);
      auVar117._0_4_ = auVar48._0_4_ + auVar64._0_4_;
      auVar117._4_4_ = auVar48._4_4_ + auVar64._4_4_;
      auVar117._8_4_ = auVar48._8_4_ + auVar64._8_4_;
      auVar117._12_4_ = auVar48._12_4_ + auVar64._12_4_;
      auVar22._8_4_ = 0x3f000000;
      auVar22._0_8_ = 0x3f0000003f000000;
      auVar22._12_4_ = 0x3f000000;
      auVar55 = vmulps_avx512vl(auVar117,auVar22);
      auVar44 = vshufps_avx(auVar55,auVar55,0x54);
      uVar102 = auVar55._0_4_;
      auVar120._4_4_ = uVar102;
      auVar120._0_4_ = uVar102;
      auVar120._8_4_ = uVar102;
      auVar120._12_4_ = uVar102;
      auVar50 = vfmadd213ps_avx512vl(local_270,auVar120,auVar59);
      auVar42 = vfmadd213ps_fma(local_280,auVar120,auVar53);
      auVar49 = vfmadd213ps_fma(local_290,auVar120,auVar54);
      auVar41 = vsubps_avx(auVar42,auVar50);
      auVar50 = vfmadd213ps_fma(auVar41,auVar120,auVar50);
      auVar41 = vsubps_avx(auVar49,auVar42);
      auVar41 = vfmadd213ps_fma(auVar41,auVar120,auVar42);
      auVar41 = vsubps_avx(auVar41,auVar50);
      auVar42 = vfmadd231ps_fma(auVar50,auVar41,auVar120);
      auVar51 = vmulps_avx512vl(auVar41,auVar138);
      auVar246._8_8_ = auVar42._0_8_;
      auVar246._0_8_ = auVar42._0_8_;
      auVar41 = vshufpd_avx(auVar42,auVar42,3);
      auVar42 = vshufps_avx(auVar55,auVar55,0x55);
      auVar49 = vsubps_avx(auVar41,auVar246);
      auVar50 = vfmadd231ps_fma(auVar246,auVar42,auVar49);
      auVar261._8_8_ = auVar51._0_8_;
      auVar261._0_8_ = auVar51._0_8_;
      auVar41 = vshufpd_avx(auVar51,auVar51,3);
      auVar41 = vsubps_avx512vl(auVar41,auVar261);
      auVar41 = vfmadd213ps_avx512vl(auVar41,auVar42,auVar261);
      auVar121._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
      auVar121._8_4_ = auVar49._8_4_ ^ 0x80000000;
      auVar121._12_4_ = auVar49._12_4_ ^ 0x80000000;
      auVar42 = vmovshdup_avx512vl(auVar41);
      auVar262._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar262._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar262._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar51 = vmovshdup_avx512vl(auVar49);
      auVar52 = vpermt2ps_avx512vl(auVar262,ZEXT416(5),auVar49);
      auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar49._0_4_)),auVar41,auVar51);
      auVar49 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar121);
      auVar159._0_4_ = auVar42._0_4_;
      auVar159._4_4_ = auVar159._0_4_;
      auVar159._8_4_ = auVar159._0_4_;
      auVar159._12_4_ = auVar159._0_4_;
      auVar41 = vdivps_avx(auVar52,auVar159);
      auVar65 = vdivps_avx512vl(auVar49,auVar159);
      fVar234 = auVar50._0_4_;
      auVar42 = vshufps_avx(auVar50,auVar50,0x55);
      auVar247._0_4_ = fVar234 * auVar41._0_4_ + auVar42._0_4_ * auVar65._0_4_;
      auVar247._4_4_ = fVar234 * auVar41._4_4_ + auVar42._4_4_ * auVar65._4_4_;
      auVar247._8_4_ = fVar234 * auVar41._8_4_ + auVar42._8_4_ * auVar65._8_4_;
      auVar247._12_4_ = fVar234 * auVar41._12_4_ + auVar42._12_4_ * auVar65._12_4_;
      auVar63 = vsubps_avx(auVar44,auVar247);
      auVar42 = vmovshdup_avx(auVar41);
      auVar44 = vinsertps_avx(auVar205,auVar239,0x1c);
      auVar263._0_4_ = auVar42._0_4_ * auVar44._0_4_;
      auVar263._4_4_ = auVar42._4_4_ * auVar44._4_4_;
      auVar263._8_4_ = auVar42._8_4_ * auVar44._8_4_;
      auVar263._12_4_ = auVar42._12_4_ * auVar44._12_4_;
      auVar67 = vinsertps_avx512f(auVar194,auVar222,0x1c);
      auVar42 = vmulps_avx512vl(auVar42,auVar67);
      auVar52 = vminps_avx512vl(auVar263,auVar42);
      auVar50 = vmaxps_avx(auVar42,auVar263);
      auVar51 = vmovshdup_avx(auVar65);
      auVar42 = vinsertps_avx(auVar239,auVar205,0x4c);
      auVar240._0_4_ = auVar51._0_4_ * auVar42._0_4_;
      auVar240._4_4_ = auVar51._4_4_ * auVar42._4_4_;
      auVar240._8_4_ = auVar51._8_4_ * auVar42._8_4_;
      auVar240._12_4_ = auVar51._12_4_ * auVar42._12_4_;
      auVar49 = vinsertps_avx(auVar222,auVar194,0x4c);
      auVar223._0_4_ = auVar51._0_4_ * auVar49._0_4_;
      auVar223._4_4_ = auVar51._4_4_ * auVar49._4_4_;
      auVar223._8_4_ = auVar51._8_4_ * auVar49._8_4_;
      auVar223._12_4_ = auVar51._12_4_ * auVar49._12_4_;
      auVar51 = vminps_avx(auVar240,auVar223);
      auVar52 = vaddps_avx512vl(auVar52,auVar51);
      auVar51 = vmaxps_avx(auVar223,auVar240);
      auVar224._0_4_ = auVar50._0_4_ + auVar51._0_4_;
      auVar224._4_4_ = auVar50._4_4_ + auVar51._4_4_;
      auVar224._8_4_ = auVar50._8_4_ + auVar51._8_4_;
      auVar224._12_4_ = auVar50._12_4_ + auVar51._12_4_;
      auVar241._8_8_ = 0x3f80000000000000;
      auVar241._0_8_ = 0x3f80000000000000;
      auVar50 = vsubps_avx(auVar241,auVar224);
      auVar51 = vsubps_avx(auVar241,auVar52);
      auVar52 = vsubps_avx(auVar48,auVar55);
      auVar55 = vsubps_avx(auVar64,auVar55);
      fVar231 = auVar52._0_4_;
      auVar264._0_4_ = fVar231 * auVar50._0_4_;
      fVar232 = auVar52._4_4_;
      auVar264._4_4_ = fVar232 * auVar50._4_4_;
      fVar233 = auVar52._8_4_;
      auVar264._8_4_ = fVar233 * auVar50._8_4_;
      fVar187 = auVar52._12_4_;
      auVar264._12_4_ = fVar187 * auVar50._12_4_;
      auVar66 = vbroadcastss_avx512vl(auVar41);
      auVar44 = vmulps_avx512vl(auVar66,auVar44);
      auVar67 = vmulps_avx512vl(auVar66,auVar67);
      auVar66 = vminps_avx512vl(auVar44,auVar67);
      auVar67 = vmaxps_avx512vl(auVar67,auVar44);
      auVar44 = vbroadcastss_avx512vl(auVar65);
      auVar42 = vmulps_avx512vl(auVar44,auVar42);
      auVar44 = vmulps_avx512vl(auVar44,auVar49);
      auVar49 = vminps_avx512vl(auVar42,auVar44);
      auVar49 = vaddps_avx512vl(auVar66,auVar49);
      auVar52 = vmulps_avx512vl(auVar52,auVar51);
      in_ZMM17 = ZEXT1664(auVar52);
      fVar234 = auVar55._0_4_;
      auVar225._0_4_ = fVar234 * auVar50._0_4_;
      fVar218 = auVar55._4_4_;
      auVar225._4_4_ = fVar218 * auVar50._4_4_;
      fVar229 = auVar55._8_4_;
      auVar225._8_4_ = fVar229 * auVar50._8_4_;
      fVar230 = auVar55._12_4_;
      auVar225._12_4_ = fVar230 * auVar50._12_4_;
      auVar242._0_4_ = fVar234 * auVar51._0_4_;
      auVar242._4_4_ = fVar218 * auVar51._4_4_;
      auVar242._8_4_ = fVar229 * auVar51._8_4_;
      auVar242._12_4_ = fVar230 * auVar51._12_4_;
      auVar44 = vmaxps_avx(auVar44,auVar42);
      auVar195._0_4_ = auVar67._0_4_ + auVar44._0_4_;
      auVar195._4_4_ = auVar67._4_4_ + auVar44._4_4_;
      auVar195._8_4_ = auVar67._8_4_ + auVar44._8_4_;
      auVar195._12_4_ = auVar67._12_4_ + auVar44._12_4_;
      auVar206._8_8_ = 0x3f800000;
      auVar206._0_8_ = 0x3f800000;
      auVar44 = vsubps_avx(auVar206,auVar195);
      auVar42 = vsubps_avx512vl(auVar206,auVar49);
      auVar255._0_4_ = fVar231 * auVar44._0_4_;
      auVar255._4_4_ = fVar232 * auVar44._4_4_;
      auVar255._8_4_ = fVar233 * auVar44._8_4_;
      auVar255._12_4_ = fVar187 * auVar44._12_4_;
      auVar248._0_4_ = fVar231 * auVar42._0_4_;
      auVar248._4_4_ = fVar232 * auVar42._4_4_;
      auVar248._8_4_ = fVar233 * auVar42._8_4_;
      auVar248._12_4_ = fVar187 * auVar42._12_4_;
      auVar196._0_4_ = fVar234 * auVar44._0_4_;
      auVar196._4_4_ = fVar218 * auVar44._4_4_;
      auVar196._8_4_ = fVar229 * auVar44._8_4_;
      auVar196._12_4_ = fVar230 * auVar44._12_4_;
      auVar207._0_4_ = fVar234 * auVar42._0_4_;
      auVar207._4_4_ = fVar218 * auVar42._4_4_;
      auVar207._8_4_ = fVar229 * auVar42._8_4_;
      auVar207._12_4_ = fVar230 * auVar42._12_4_;
      auVar44 = vminps_avx(auVar255,auVar248);
      auVar42 = vminps_avx512vl(auVar196,auVar207);
      auVar49 = vminps_avx512vl(auVar44,auVar42);
      auVar44 = vmaxps_avx(auVar248,auVar255);
      auVar42 = vmaxps_avx(auVar207,auVar196);
      auVar42 = vmaxps_avx(auVar42,auVar44);
      auVar50 = vminps_avx512vl(auVar264,auVar52);
      auVar44 = vminps_avx(auVar225,auVar242);
      auVar44 = vminps_avx(auVar50,auVar44);
      auVar44 = vhaddps_avx(auVar49,auVar44);
      auVar50 = vmaxps_avx512vl(auVar52,auVar264);
      auVar49 = vmaxps_avx(auVar242,auVar225);
      auVar49 = vmaxps_avx(auVar49,auVar50);
      auVar42 = vhaddps_avx(auVar42,auVar49);
      auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
      auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
      auVar197._0_4_ = auVar44._0_4_ + auVar63._0_4_;
      auVar197._4_4_ = auVar44._4_4_ + auVar63._4_4_;
      auVar197._8_4_ = auVar44._8_4_ + auVar63._8_4_;
      auVar197._12_4_ = auVar44._12_4_ + auVar63._12_4_;
      auVar208._0_4_ = auVar42._0_4_ + auVar63._0_4_;
      auVar208._4_4_ = auVar42._4_4_ + auVar63._4_4_;
      auVar208._8_4_ = auVar42._8_4_ + auVar63._8_4_;
      auVar208._12_4_ = auVar42._12_4_ + auVar63._12_4_;
      auVar44 = vmaxps_avx(auVar48,auVar197);
      auVar42 = vminps_avx(auVar208,auVar64);
      uVar1 = vcmpps_avx512vl(auVar42,auVar44,1);
    } while ((uVar1 & 3) != 0);
    uVar1 = vcmpps_avx512vl(auVar208,auVar64,1);
    uVar18 = vcmpps_avx512vl(auVar39,auVar197,1);
    if (((ushort)uVar18 & (ushort)uVar1 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar44 = vmovshdup_avx(auVar197);
      bVar24 = auVar61._0_4_ < auVar44._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
    }
    local_450 = auVar58._0_4_;
    fStack_44c = auVar58._4_4_;
    fStack_448 = auVar58._8_4_;
    fStack_444 = auVar58._12_4_;
    if (((3 < (uint)uVar26 || uVar5 != 0 && !bVar36) | bVar24) == 1) {
      lVar28 = 200;
      do {
        auVar39 = vsubss_avx512f(auVar56,auVar63);
        fVar229 = auVar39._0_4_;
        fVar234 = fVar229 * fVar229 * fVar229;
        fVar230 = auVar63._0_4_;
        fVar218 = fVar230 * 3.0 * fVar229 * fVar229;
        fVar229 = fVar229 * fVar230 * fVar230 * 3.0;
        auVar141._4_4_ = fVar234;
        auVar141._0_4_ = fVar234;
        auVar141._8_4_ = fVar234;
        auVar141._12_4_ = fVar234;
        auVar135._4_4_ = fVar218;
        auVar135._0_4_ = fVar218;
        auVar135._8_4_ = fVar218;
        auVar135._12_4_ = fVar218;
        auVar106._4_4_ = fVar229;
        auVar106._0_4_ = fVar229;
        auVar106._8_4_ = fVar229;
        auVar106._12_4_ = fVar229;
        fVar230 = fVar230 * fVar230 * fVar230;
        auVar175._0_4_ = local_450 * fVar230;
        auVar175._4_4_ = fStack_44c * fVar230;
        auVar175._8_4_ = fStack_448 * fVar230;
        auVar175._12_4_ = fStack_444 * fVar230;
        auVar39 = vfmadd231ps_fma(auVar175,auVar54,auVar106);
        auVar39 = vfmadd231ps_fma(auVar39,auVar53,auVar135);
        auVar39 = vfmadd231ps_avx512vl(auVar39,auVar59,auVar141);
        auVar107._8_8_ = auVar39._0_8_;
        auVar107._0_8_ = auVar39._0_8_;
        auVar39 = vshufpd_avx(auVar39,auVar39,3);
        auVar44 = vshufps_avx(auVar63,auVar63,0x55);
        auVar39 = vsubps_avx(auVar39,auVar107);
        auVar44 = vfmadd213ps_fma(auVar39,auVar44,auVar107);
        fVar234 = auVar44._0_4_;
        auVar39 = vshufps_avx(auVar44,auVar44,0x55);
        auVar108._0_4_ = auVar41._0_4_ * fVar234 + auVar65._0_4_ * auVar39._0_4_;
        auVar108._4_4_ = auVar41._4_4_ * fVar234 + auVar65._4_4_ * auVar39._4_4_;
        auVar108._8_4_ = auVar41._8_4_ * fVar234 + auVar65._8_4_ * auVar39._8_4_;
        auVar108._12_4_ = auVar41._12_4_ * fVar234 + auVar65._12_4_ * auVar39._12_4_;
        auVar63 = vsubps_avx(auVar63,auVar108);
        auVar39 = vandps_avx512vl(auVar44,auVar270._0_16_);
        auVar44 = vprolq_avx512vl(auVar39,0x20);
        auVar39 = vmaxss_avx(auVar44,auVar39);
        bVar36 = auVar39._0_4_ <= fVar109;
        if (auVar39._0_4_ < fVar109) {
          auVar39 = vucomiss_avx512f(auVar60);
          if (bVar36) {
            auVar41 = vucomiss_avx512f(auVar39);
            auVar271 = ZEXT1664(auVar41);
            if (bVar36) {
              vmovshdup_avx(auVar39);
              auVar41 = vucomiss_avx512f(auVar60);
              if (bVar36) {
                auVar44 = vucomiss_avx512f(auVar41);
                auVar271 = ZEXT1664(auVar44);
                if (bVar36) {
                  auVar42 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar56 = vinsertps_avx(auVar42,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar42 = vdpps_avx(auVar56,local_2a0,0x7f);
                  auVar48 = vdpps_avx(auVar56,local_2b0,0x7f);
                  auVar49 = vdpps_avx(auVar56,local_2c0,0x7f);
                  auVar50 = vdpps_avx(auVar56,local_2d0,0x7f);
                  auVar51 = vdpps_avx(auVar56,local_2e0,0x7f);
                  auVar52 = vdpps_avx(auVar56,local_2f0,0x7f);
                  auVar55 = vdpps_avx(auVar56,local_300,0x7f);
                  auVar56 = vdpps_avx(auVar56,local_310,0x7f);
                  auVar63 = vsubss_avx512f(auVar44,auVar41);
                  fVar234 = auVar41._0_4_;
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * auVar51._0_4_)),auVar63,auVar42
                                           );
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar234)),auVar63,auVar48
                                           );
                  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar234)),auVar63,auVar49
                                           );
                  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * auVar56._0_4_)),auVar63,auVar50
                                           );
                  auVar44 = vsubss_avx512f(auVar44,auVar39);
                  auVar176._0_4_ = auVar44._0_4_;
                  fVar234 = auVar176._0_4_ * auVar176._0_4_ * auVar176._0_4_;
                  local_120 = auVar39._0_4_;
                  fVar218 = local_120 * 3.0 * auVar176._0_4_ * auVar176._0_4_;
                  fVar229 = auVar176._0_4_ * local_120 * local_120 * 3.0;
                  fVar231 = local_120 * local_120 * local_120;
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar49._0_4_)),
                                            ZEXT416((uint)fVar229),auVar48);
                  auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar218),auVar42);
                  auVar41 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar234),auVar41);
                  fVar230 = auVar41._0_4_;
                  if ((fVar101 <= fVar230) &&
                     (fVar232 = *(float *)(ray + k * 4 + 0x100), fVar230 <= fVar232)) {
                    auVar41 = vshufps_avx(auVar39,auVar39,0x55);
                    auVar198._8_4_ = 0x3f800000;
                    auVar198._0_8_ = 0x3f8000003f800000;
                    auVar198._12_4_ = 0x3f800000;
                    auVar44 = vsubps_avx(auVar198,auVar41);
                    fVar233 = auVar41._0_4_;
                    auVar209._0_4_ = fVar233 * (float)local_360._0_4_;
                    fVar187 = auVar41._4_4_;
                    auVar209._4_4_ = fVar187 * (float)local_360._4_4_;
                    fVar188 = auVar41._8_4_;
                    auVar209._8_4_ = fVar188 * fStack_358;
                    fVar189 = auVar41._12_4_;
                    auVar209._12_4_ = fVar189 * fStack_354;
                    auVar213._0_4_ = fVar233 * (float)local_370._0_4_;
                    auVar213._4_4_ = fVar187 * (float)local_370._4_4_;
                    auVar213._8_4_ = fVar188 * fStack_368;
                    auVar213._12_4_ = fVar189 * fStack_364;
                    auVar226._0_4_ = fVar233 * (float)local_380._0_4_;
                    auVar226._4_4_ = fVar187 * (float)local_380._4_4_;
                    auVar226._8_4_ = fVar188 * fStack_378;
                    auVar226._12_4_ = fVar189 * fStack_374;
                    auVar184._0_4_ = fVar233 * (float)local_390._0_4_;
                    auVar184._4_4_ = fVar187 * (float)local_390._4_4_;
                    auVar184._8_4_ = fVar188 * fStack_388;
                    auVar184._12_4_ = fVar189 * fStack_384;
                    auVar41 = vfmadd231ps_fma(auVar209,auVar44,local_320);
                    auVar42 = vfmadd231ps_fma(auVar213,auVar44,local_330);
                    auVar48 = vfmadd231ps_fma(auVar226,auVar44,local_340);
                    auVar49 = vfmadd231ps_fma(auVar184,auVar44,local_350);
                    auVar41 = vsubps_avx(auVar42,auVar41);
                    auVar44 = vsubps_avx(auVar48,auVar42);
                    auVar42 = vsubps_avx(auVar49,auVar48);
                    auVar227._0_4_ = local_120 * auVar44._0_4_;
                    auVar227._4_4_ = local_120 * auVar44._4_4_;
                    auVar227._8_4_ = local_120 * auVar44._8_4_;
                    auVar227._12_4_ = local_120 * auVar44._12_4_;
                    auVar176._4_4_ = auVar176._0_4_;
                    auVar176._8_4_ = auVar176._0_4_;
                    auVar176._12_4_ = auVar176._0_4_;
                    auVar41 = vfmadd231ps_fma(auVar227,auVar176,auVar41);
                    auVar185._0_4_ = local_120 * auVar42._0_4_;
                    auVar185._4_4_ = local_120 * auVar42._4_4_;
                    auVar185._8_4_ = local_120 * auVar42._8_4_;
                    auVar185._12_4_ = local_120 * auVar42._12_4_;
                    auVar44 = vfmadd231ps_fma(auVar185,auVar176,auVar44);
                    auVar186._0_4_ = local_120 * auVar44._0_4_;
                    auVar186._4_4_ = local_120 * auVar44._4_4_;
                    auVar186._8_4_ = local_120 * auVar44._8_4_;
                    auVar186._12_4_ = local_120 * auVar44._12_4_;
                    auVar41 = vfmadd231ps_fma(auVar186,auVar176,auVar41);
                    auVar41 = vmulps_avx512vl(auVar41,auVar138);
                    pGVar6 = (context->scene->geometries).items[uVar33].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01c0539b:
                      bVar24 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar24 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar160._0_4_ = fVar231 * (float)local_3e0._0_4_;
                      auVar160._4_4_ = fVar231 * (float)local_3e0._4_4_;
                      auVar160._8_4_ = fVar231 * fStack_3d8;
                      auVar160._12_4_ = fVar231 * fStack_3d4;
                      auVar142._4_4_ = fVar229;
                      auVar142._0_4_ = fVar229;
                      auVar142._8_4_ = fVar229;
                      auVar142._12_4_ = fVar229;
                      auVar44 = vfmadd132ps_fma(auVar142,auVar160,local_3d0);
                      auVar136._4_4_ = fVar218;
                      auVar136._0_4_ = fVar218;
                      auVar136._8_4_ = fVar218;
                      auVar136._12_4_ = fVar218;
                      auVar44 = vfmadd132ps_fma(auVar136,auVar44,local_3c0);
                      auVar122._4_4_ = fVar234;
                      auVar122._0_4_ = fVar234;
                      auVar122._8_4_ = fVar234;
                      auVar122._12_4_ = fVar234;
                      auVar48 = vfmadd132ps_fma(auVar122,auVar44,local_3b0);
                      auVar44 = vshufps_avx(auVar48,auVar48,0xc9);
                      auVar42 = vshufps_avx(auVar41,auVar41,0xc9);
                      auVar123._0_4_ = auVar48._0_4_ * auVar42._0_4_;
                      auVar123._4_4_ = auVar48._4_4_ * auVar42._4_4_;
                      auVar123._8_4_ = auVar48._8_4_ * auVar42._8_4_;
                      auVar123._12_4_ = auVar48._12_4_ * auVar42._12_4_;
                      auVar41 = vfmsub231ps_fma(auVar123,auVar41,auVar44);
                      auVar144._8_4_ = 1;
                      auVar144._0_8_ = 0x100000001;
                      auVar144._12_4_ = 1;
                      auVar144._16_4_ = 1;
                      auVar144._20_4_ = 1;
                      auVar144._24_4_ = 1;
                      auVar144._28_4_ = 1;
                      local_100 = vpermps_avx2(auVar144,ZEXT1632(auVar39));
                      auVar68 = vpermps_avx2(auVar144,ZEXT1632(auVar41));
                      auVar164._8_4_ = 2;
                      auVar164._0_8_ = 0x200000002;
                      auVar164._12_4_ = 2;
                      auVar164._16_4_ = 2;
                      auVar164._20_4_ = 2;
                      auVar164._24_4_ = 2;
                      auVar164._28_4_ = 2;
                      local_160 = vpermps_avx2(auVar164,ZEXT1632(auVar41));
                      local_140 = auVar41._0_4_;
                      local_180[0] = (RTCHitN)auVar68[0];
                      local_180[1] = (RTCHitN)auVar68[1];
                      local_180[2] = (RTCHitN)auVar68[2];
                      local_180[3] = (RTCHitN)auVar68[3];
                      local_180[4] = (RTCHitN)auVar68[4];
                      local_180[5] = (RTCHitN)auVar68[5];
                      local_180[6] = (RTCHitN)auVar68[6];
                      local_180[7] = (RTCHitN)auVar68[7];
                      local_180[8] = (RTCHitN)auVar68[8];
                      local_180[9] = (RTCHitN)auVar68[9];
                      local_180[10] = (RTCHitN)auVar68[10];
                      local_180[0xb] = (RTCHitN)auVar68[0xb];
                      local_180[0xc] = (RTCHitN)auVar68[0xc];
                      local_180[0xd] = (RTCHitN)auVar68[0xd];
                      local_180[0xe] = (RTCHitN)auVar68[0xe];
                      local_180[0xf] = (RTCHitN)auVar68[0xf];
                      local_180[0x10] = (RTCHitN)auVar68[0x10];
                      local_180[0x11] = (RTCHitN)auVar68[0x11];
                      local_180[0x12] = (RTCHitN)auVar68[0x12];
                      local_180[0x13] = (RTCHitN)auVar68[0x13];
                      local_180[0x14] = (RTCHitN)auVar68[0x14];
                      local_180[0x15] = (RTCHitN)auVar68[0x15];
                      local_180[0x16] = (RTCHitN)auVar68[0x16];
                      local_180[0x17] = (RTCHitN)auVar68[0x17];
                      local_180[0x18] = (RTCHitN)auVar68[0x18];
                      local_180[0x19] = (RTCHitN)auVar68[0x19];
                      local_180[0x1a] = (RTCHitN)auVar68[0x1a];
                      local_180[0x1b] = (RTCHitN)auVar68[0x1b];
                      local_180[0x1c] = (RTCHitN)auVar68[0x1c];
                      local_180[0x1d] = (RTCHitN)auVar68[0x1d];
                      local_180[0x1e] = (RTCHitN)auVar68[0x1e];
                      local_180[0x1f] = (RTCHitN)auVar68[0x1f];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      fStack_11c = local_120;
                      fStack_118 = local_120;
                      fStack_114 = local_120;
                      fStack_110 = local_120;
                      fStack_10c = local_120;
                      fStack_108 = local_120;
                      fStack_104 = local_120;
                      local_e0 = local_1c0._0_8_;
                      uStack_d8 = local_1c0._8_8_;
                      uStack_d0 = local_1c0._16_8_;
                      uStack_c8 = local_1c0._24_8_;
                      local_c0 = local_1e0;
                      vpcmpeqd_avx2(local_1e0,local_1e0);
                      uStack_9c = context->user->instID[0];
                      local_a0 = uStack_9c;
                      uStack_98 = uStack_9c;
                      uStack_94 = uStack_9c;
                      uStack_90 = uStack_9c;
                      uStack_8c = uStack_9c;
                      uStack_88 = uStack_9c;
                      uStack_84 = uStack_9c;
                      uStack_7c = context->user->instPrimID[0];
                      local_80 = uStack_7c;
                      uStack_78 = uStack_7c;
                      uStack_74 = uStack_7c;
                      uStack_70 = uStack_7c;
                      uStack_6c = uStack_7c;
                      uStack_68 = uStack_7c;
                      uStack_64 = uStack_7c;
                      *(float *)(ray + k * 4 + 0x100) = fVar230;
                      local_400 = local_200;
                      local_430.valid = (int *)local_400;
                      local_430.geometryUserPtr = pGVar6->userPtr;
                      local_430.context = context->user;
                      local_430.ray = (RTCRayN *)ray;
                      local_430.hit = local_180;
                      local_430.N = 8;
                      if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar6->occlusionFilterN)(&local_430);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar272 = ZEXT1664(auVar39);
                        auVar271 = ZEXT464(0x3f800000);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar269 = ZEXT1664(auVar39);
                        auVar39 = vxorps_avx512vl(auVar60,auVar60);
                        auVar265 = ZEXT1664(auVar39);
                      }
                      auVar39 = auVar265._0_16_;
                      if (local_400 == (undefined1  [32])0x0) {
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar270 = ZEXT1664(auVar39);
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar266 = ZEXT3264(auVar68);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar267 = ZEXT1664(auVar39);
                        auVar268 = ZEXT3264(_DAT_01feed20);
                        in_ZMM28 = ZEXT1664(_DAT_01feecd0);
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if (p_Var9 == (RTCFilterFunctionN)0x0) {
                          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar270 = ZEXT1664(auVar39);
                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar266 = ZEXT3264(auVar68);
                          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar267 = ZEXT1664(auVar39);
                          auVar268 = ZEXT3264(_DAT_01feed20);
                          in_ZMM28 = ZEXT1664(_DAT_01feecd0);
                        }
                        else {
                          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar270 = ZEXT1664(auVar60);
                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar266 = ZEXT3264(auVar68);
                          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar267 = ZEXT1664(auVar60);
                          auVar268 = ZEXT3264(_DAT_01feed20);
                          in_ZMM28 = ZEXT1664(_DAT_01feecd0);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var9)(&local_430);
                            in_ZMM28 = ZEXT1664(_DAT_01feecd0);
                            auVar268 = ZEXT3264(_DAT_01feed20);
                            auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar267 = ZEXT1664(auVar60);
                            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar266 = ZEXT3264(auVar68);
                            auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar272 = ZEXT1664(auVar60);
                            auVar271 = ZEXT464(0x3f800000);
                            auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar269 = ZEXT1664(auVar60);
                            auVar39 = vxorps_avx512vl(auVar39,auVar39);
                            auVar265 = ZEXT1664(auVar39);
                            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar270 = ZEXT1664(auVar39);
                          }
                        }
                        uVar1 = vptestmd_avx512vl(local_400,local_400);
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar36 = (bool)((byte)uVar1 & 1);
                        bVar37 = (bool)((byte)(uVar1 >> 1) & 1);
                        bVar34 = (bool)((byte)(uVar1 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar1 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar1 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar1 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar1 >> 6) & 1);
                        bVar17 = SUB81(uVar1 >> 7,0);
                        *(uint *)(local_430.ray + 0x100) =
                             (uint)bVar36 * auVar68._0_4_ |
                             (uint)!bVar36 * *(int *)(local_430.ray + 0x100);
                        *(uint *)(local_430.ray + 0x104) =
                             (uint)bVar37 * auVar68._4_4_ |
                             (uint)!bVar37 * *(int *)(local_430.ray + 0x104);
                        *(uint *)(local_430.ray + 0x108) =
                             (uint)bVar34 * auVar68._8_4_ |
                             (uint)!bVar34 * *(int *)(local_430.ray + 0x108);
                        *(uint *)(local_430.ray + 0x10c) =
                             (uint)bVar35 * auVar68._12_4_ |
                             (uint)!bVar35 * *(int *)(local_430.ray + 0x10c);
                        *(uint *)(local_430.ray + 0x110) =
                             (uint)bVar14 * auVar68._16_4_ |
                             (uint)!bVar14 * *(int *)(local_430.ray + 0x110);
                        *(uint *)(local_430.ray + 0x114) =
                             (uint)bVar15 * auVar68._20_4_ |
                             (uint)!bVar15 * *(int *)(local_430.ray + 0x114);
                        *(uint *)(local_430.ray + 0x118) =
                             (uint)bVar16 * auVar68._24_4_ |
                             (uint)!bVar16 * *(int *)(local_430.ray + 0x118);
                        *(uint *)(local_430.ray + 0x11c) =
                             (uint)bVar17 * auVar68._28_4_ |
                             (uint)!bVar17 * *(int *)(local_430.ray + 0x11c);
                        bVar24 = 1;
                        if (local_400 != (undefined1  [32])0x0) goto LAB_01c0539d;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar232;
                      goto LAB_01c0539b;
                    }
LAB_01c0539d:
                    bVar32 = (bool)(bVar32 | bVar24);
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01c0446e;
    }
    auVar116 = vinsertps_avx(auVar61,auVar62,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }